

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiIntersector1<8>::
     occluded_t<embree::avx512::RibbonCurve1Intersector1<embree::BezierCurveT,8>,embree::avx512::Occluded1EpilogMU<8,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [12];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar13;
  Geometry *pGVar14;
  RTCFilterFunctionN p_Var15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  undefined1 auVar22 [16];
  undefined8 uVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  byte bVar69;
  long lVar70;
  Geometry *geometry;
  long lVar71;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  ulong uVar72;
  ulong uVar73;
  bool bVar74;
  undefined8 unaff_R12;
  ulong uVar75;
  long lVar76;
  byte bVar77;
  float fVar78;
  float fVar79;
  float fVar125;
  float fVar129;
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar84 [16];
  float fVar126;
  float fVar132;
  float fVar133;
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  float fVar127;
  float fVar128;
  float fVar130;
  float fVar131;
  float fVar134;
  float fVar135;
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined4 uVar136;
  float fVar139;
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined8 uVar140;
  undefined1 auVar141 [32];
  float fVar142;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 in_ZMM4 [64];
  float fVar156;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  float fVar159;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  undefined1 auVar163 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [16];
  undefined1 auVar166 [32];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [64];
  undefined1 auVar175 [64];
  undefined1 auVar176 [64];
  undefined1 auVar177 [64];
  undefined1 auVar178 [64];
  undefined1 auVar179 [64];
  undefined1 auVar180 [64];
  undefined1 auVar181 [64];
  undefined1 auVar182 [64];
  undefined1 auVar183 [64];
  RTCFilterFunctionNArguments args;
  int local_54c;
  long local_548;
  Primitive *local_540;
  Ray *local_538;
  ulong local_530;
  ulong local_528;
  Precalculations *local_520;
  float local_514;
  undefined8 local_510;
  undefined8 uStack_508;
  RTCFilterFunctionNArguments local_500;
  undefined8 local_4d0;
  undefined4 local_4c8;
  float local_4c4;
  undefined4 local_4c0;
  undefined4 local_4bc;
  undefined4 local_4b8;
  uint local_4b4;
  uint local_4b0;
  RayQueryContext *local_498;
  Geometry *local_490;
  ulong local_488;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [32];
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  ulong local_3a8;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined4 local_240;
  int local_23c;
  undefined1 local_230 [16];
  undefined1 local_220 [16];
  undefined8 local_210;
  undefined8 uStack_208;
  float local_1e0 [4];
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined4 uStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  local_520 = pre;
  uVar75 = (ulong)(byte)prim[1];
  fVar159 = *(float *)(prim + uVar75 * 0x19 + 0x12);
  auVar22 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + uVar75 * 0x19 + 6));
  fVar142 = fVar159 * (ray->dir).field_0.m128[0];
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar75 * 4 + 6);
  auVar94 = vpmovsxbd_avx2(auVar81);
  fVar156 = fVar159 * auVar22._0_4_;
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar75 * 5 + 6);
  auVar91 = vpmovsxbd_avx2(auVar83);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar75 * 6 + 6);
  auVar92 = vpmovsxbd_avx2(auVar82);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar75 * 0xb + 6);
  auVar93 = vpmovsxbd_avx2(auVar8);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar75 * 0xc + 6);
  auVar96 = vpmovsxbd_avx2(auVar9);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar75 * 0xd + 6);
  auVar95 = vpmovsxbd_avx2(auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar75 * 0x12 + 6);
  auVar89 = vpmovsxbd_avx2(auVar11);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar103 = vcvtdq2ps_avx(auVar89);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar75 * 0x13 + 6);
  auVar102 = vpmovsxbd_avx2(auVar80);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar75 * 0x14 + 6);
  auVar97 = vpmovsxbd_avx2(auVar12);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar85 = vbroadcastss_avx512vl(ZEXT416(1));
  auVar170._4_4_ = fVar142;
  auVar170._0_4_ = fVar142;
  auVar170._8_4_ = fVar142;
  auVar170._12_4_ = fVar142;
  auVar170._16_4_ = fVar142;
  auVar170._20_4_ = fVar142;
  auVar170._24_4_ = fVar142;
  auVar170._28_4_ = fVar142;
  auVar90 = ZEXT1632(CONCAT412(fVar159 * (ray->dir).field_0.m128[3],
                               CONCAT48(fVar159 * (ray->dir).field_0.m128[2],
                                        CONCAT44(fVar159 * (ray->dir).field_0.m128[1],fVar142))));
  auVar86 = vpermps_avx512vl(auVar85,auVar90);
  auVar87 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar88 = vpermps_avx512vl(auVar87,auVar90);
  fVar142 = auVar88._0_4_;
  auVar183._0_4_ = fVar142 * auVar92._0_4_;
  fVar139 = auVar88._4_4_;
  auVar183._4_4_ = fVar139 * auVar92._4_4_;
  fVar78 = auVar88._8_4_;
  auVar183._8_4_ = fVar78 * auVar92._8_4_;
  fVar79 = auVar88._12_4_;
  auVar183._12_4_ = fVar79 * auVar92._12_4_;
  fVar125 = auVar88._16_4_;
  auVar183._16_4_ = fVar125 * auVar92._16_4_;
  fVar126 = auVar88._20_4_;
  auVar183._20_4_ = fVar126 * auVar92._20_4_;
  fVar129 = auVar88._24_4_;
  auVar183._28_36_ = in_ZMM4._28_36_;
  auVar183._24_4_ = fVar129 * auVar92._24_4_;
  auVar90._4_4_ = auVar95._4_4_ * fVar139;
  auVar90._0_4_ = auVar95._0_4_ * fVar142;
  auVar90._8_4_ = auVar95._8_4_ * fVar78;
  auVar90._12_4_ = auVar95._12_4_ * fVar79;
  auVar90._16_4_ = auVar95._16_4_ * fVar125;
  auVar90._20_4_ = auVar95._20_4_ * fVar126;
  auVar90._24_4_ = auVar95._24_4_ * fVar129;
  auVar90._28_4_ = auVar89._28_4_;
  auVar89._4_4_ = auVar97._4_4_ * fVar139;
  auVar89._0_4_ = auVar97._0_4_ * fVar142;
  auVar89._8_4_ = auVar97._8_4_ * fVar78;
  auVar89._12_4_ = auVar97._12_4_ * fVar79;
  auVar89._16_4_ = auVar97._16_4_ * fVar125;
  auVar89._20_4_ = auVar97._20_4_ * fVar126;
  auVar89._24_4_ = auVar97._24_4_ * fVar129;
  auVar89._28_4_ = auVar88._28_4_;
  auVar81 = vfmadd231ps_fma(auVar183._0_32_,auVar86,auVar91);
  auVar83 = vfmadd231ps_fma(auVar90,auVar86,auVar96);
  auVar82 = vfmadd231ps_fma(auVar89,auVar102,auVar86);
  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar170,auVar94);
  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar170,auVar93);
  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar103,auVar170);
  auVar171._4_4_ = fVar156;
  auVar171._0_4_ = fVar156;
  auVar171._8_4_ = fVar156;
  auVar171._12_4_ = fVar156;
  auVar171._16_4_ = fVar156;
  auVar171._20_4_ = fVar156;
  auVar171._24_4_ = fVar156;
  auVar171._28_4_ = fVar156;
  auVar90 = ZEXT1632(CONCAT412(fVar159 * auVar22._12_4_,
                               CONCAT48(fVar159 * auVar22._8_4_,
                                        CONCAT44(fVar159 * auVar22._4_4_,fVar156))));
  auVar89 = vpermps_avx512vl(auVar85,auVar90);
  auVar90 = vpermps_avx512vl(auVar87,auVar90);
  fVar159 = auVar90._0_4_;
  auVar100._0_4_ = fVar159 * auVar92._0_4_;
  fVar142 = auVar90._4_4_;
  auVar100._4_4_ = fVar142 * auVar92._4_4_;
  fVar139 = auVar90._8_4_;
  auVar100._8_4_ = fVar139 * auVar92._8_4_;
  fVar78 = auVar90._12_4_;
  auVar100._12_4_ = fVar78 * auVar92._12_4_;
  fVar79 = auVar90._16_4_;
  auVar100._16_4_ = fVar79 * auVar92._16_4_;
  fVar125 = auVar90._20_4_;
  auVar100._20_4_ = fVar125 * auVar92._20_4_;
  fVar126 = auVar90._24_4_;
  auVar100._24_4_ = fVar126 * auVar92._24_4_;
  auVar100._28_4_ = 0;
  auVar85._4_4_ = auVar95._4_4_ * fVar142;
  auVar85._0_4_ = auVar95._0_4_ * fVar159;
  auVar85._8_4_ = auVar95._8_4_ * fVar139;
  auVar85._12_4_ = auVar95._12_4_ * fVar78;
  auVar85._16_4_ = auVar95._16_4_ * fVar79;
  auVar85._20_4_ = auVar95._20_4_ * fVar125;
  auVar85._24_4_ = auVar95._24_4_ * fVar126;
  auVar85._28_4_ = auVar92._28_4_;
  auVar95._4_4_ = auVar97._4_4_ * fVar142;
  auVar95._0_4_ = auVar97._0_4_ * fVar159;
  auVar95._8_4_ = auVar97._8_4_ * fVar139;
  auVar95._12_4_ = auVar97._12_4_ * fVar78;
  auVar95._16_4_ = auVar97._16_4_ * fVar79;
  auVar95._20_4_ = auVar97._20_4_ * fVar125;
  auVar95._24_4_ = auVar97._24_4_ * fVar126;
  auVar95._28_4_ = auVar90._28_4_;
  auVar8 = vfmadd231ps_fma(auVar100,auVar89,auVar91);
  auVar9 = vfmadd231ps_fma(auVar85,auVar89,auVar96);
  auVar10 = vfmadd231ps_fma(auVar95,auVar89,auVar102);
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar171,auVar94);
  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar171,auVar93);
  auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar171,auVar103);
  auVar164._8_4_ = 0x7fffffff;
  auVar164._0_8_ = 0x7fffffff7fffffff;
  auVar164._12_4_ = 0x7fffffff;
  auVar164._16_4_ = 0x7fffffff;
  auVar164._20_4_ = 0x7fffffff;
  auVar164._24_4_ = 0x7fffffff;
  auVar164._28_4_ = 0x7fffffff;
  auVar101._8_4_ = 0x219392ef;
  auVar101._0_8_ = 0x219392ef219392ef;
  auVar101._12_4_ = 0x219392ef;
  auVar101._16_4_ = 0x219392ef;
  auVar101._20_4_ = 0x219392ef;
  auVar101._24_4_ = 0x219392ef;
  auVar101._28_4_ = 0x219392ef;
  auVar94 = vandps_avx(auVar164,ZEXT1632(auVar81));
  uVar72 = vcmpps_avx512vl(auVar94,auVar101,1);
  bVar74 = (bool)((byte)uVar72 & 1);
  auVar86._0_4_ = (uint)bVar74 * 0x219392ef | (uint)!bVar74 * auVar81._0_4_;
  bVar74 = (bool)((byte)(uVar72 >> 1) & 1);
  auVar86._4_4_ = (uint)bVar74 * 0x219392ef | (uint)!bVar74 * auVar81._4_4_;
  bVar74 = (bool)((byte)(uVar72 >> 2) & 1);
  auVar86._8_4_ = (uint)bVar74 * 0x219392ef | (uint)!bVar74 * auVar81._8_4_;
  bVar74 = (bool)((byte)(uVar72 >> 3) & 1);
  auVar86._12_4_ = (uint)bVar74 * 0x219392ef | (uint)!bVar74 * auVar81._12_4_;
  auVar86._16_4_ = (uint)((byte)(uVar72 >> 4) & 1) * 0x219392ef;
  auVar86._20_4_ = (uint)((byte)(uVar72 >> 5) & 1) * 0x219392ef;
  auVar86._24_4_ = (uint)((byte)(uVar72 >> 6) & 1) * 0x219392ef;
  auVar86._28_4_ = (uint)(byte)(uVar72 >> 7) * 0x219392ef;
  auVar94 = vandps_avx(auVar164,ZEXT1632(auVar83));
  uVar72 = vcmpps_avx512vl(auVar94,auVar101,1);
  bVar74 = (bool)((byte)uVar72 & 1);
  auVar87._0_4_ = (uint)bVar74 * 0x219392ef | (uint)!bVar74 * auVar83._0_4_;
  bVar74 = (bool)((byte)(uVar72 >> 1) & 1);
  auVar87._4_4_ = (uint)bVar74 * 0x219392ef | (uint)!bVar74 * auVar83._4_4_;
  bVar74 = (bool)((byte)(uVar72 >> 2) & 1);
  auVar87._8_4_ = (uint)bVar74 * 0x219392ef | (uint)!bVar74 * auVar83._8_4_;
  bVar74 = (bool)((byte)(uVar72 >> 3) & 1);
  auVar87._12_4_ = (uint)bVar74 * 0x219392ef | (uint)!bVar74 * auVar83._12_4_;
  auVar87._16_4_ = (uint)((byte)(uVar72 >> 4) & 1) * 0x219392ef;
  auVar87._20_4_ = (uint)((byte)(uVar72 >> 5) & 1) * 0x219392ef;
  auVar87._24_4_ = (uint)((byte)(uVar72 >> 6) & 1) * 0x219392ef;
  auVar87._28_4_ = (uint)(byte)(uVar72 >> 7) * 0x219392ef;
  auVar94 = vandps_avx(auVar164,ZEXT1632(auVar82));
  uVar72 = vcmpps_avx512vl(auVar94,auVar101,1);
  bVar74 = (bool)((byte)uVar72 & 1);
  auVar94._0_4_ = (uint)bVar74 * 0x219392ef | (uint)!bVar74 * auVar82._0_4_;
  bVar74 = (bool)((byte)(uVar72 >> 1) & 1);
  auVar94._4_4_ = (uint)bVar74 * 0x219392ef | (uint)!bVar74 * auVar82._4_4_;
  bVar74 = (bool)((byte)(uVar72 >> 2) & 1);
  auVar94._8_4_ = (uint)bVar74 * 0x219392ef | (uint)!bVar74 * auVar82._8_4_;
  bVar74 = (bool)((byte)(uVar72 >> 3) & 1);
  auVar94._12_4_ = (uint)bVar74 * 0x219392ef | (uint)!bVar74 * auVar82._12_4_;
  auVar94._16_4_ = (uint)((byte)(uVar72 >> 4) & 1) * 0x219392ef;
  auVar94._20_4_ = (uint)((byte)(uVar72 >> 5) & 1) * 0x219392ef;
  auVar94._24_4_ = (uint)((byte)(uVar72 >> 6) & 1) * 0x219392ef;
  auVar94._28_4_ = (uint)(byte)(uVar72 >> 7) * 0x219392ef;
  auVar91 = vrcp14ps_avx512vl(auVar86);
  auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar93 = vfnmadd213ps_avx512vl(auVar86,auVar91,auVar92);
  auVar81 = vfmadd132ps_fma(auVar93,auVar91,auVar91);
  auVar91 = vrcp14ps_avx512vl(auVar87);
  auVar93 = vfnmadd213ps_avx512vl(auVar87,auVar91,auVar92);
  auVar83 = vfmadd132ps_fma(auVar93,auVar91,auVar91);
  auVar91 = vrcp14ps_avx512vl(auVar94);
  auVar94 = vfnmadd213ps_avx512vl(auVar94,auVar91,auVar92);
  auVar82 = vfmadd132ps_fma(auVar94,auVar91,auVar91);
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar75 * 7 + 6));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar8));
  auVar103._4_4_ = auVar81._4_4_ * auVar94._4_4_;
  auVar103._0_4_ = auVar81._0_4_ * auVar94._0_4_;
  auVar103._8_4_ = auVar81._8_4_ * auVar94._8_4_;
  auVar103._12_4_ = auVar81._12_4_ * auVar94._12_4_;
  auVar103._16_4_ = auVar94._16_4_ * 0.0;
  auVar103._20_4_ = auVar94._20_4_ * 0.0;
  auVar103._24_4_ = auVar94._24_4_ * 0.0;
  auVar103._28_4_ = auVar94._28_4_;
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar75 * 9 + 6));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar8));
  auVar99._0_4_ = auVar81._0_4_ * auVar94._0_4_;
  auVar99._4_4_ = auVar81._4_4_ * auVar94._4_4_;
  auVar99._8_4_ = auVar81._8_4_ * auVar94._8_4_;
  auVar99._12_4_ = auVar81._12_4_ * auVar94._12_4_;
  auVar99._16_4_ = auVar94._16_4_ * 0.0;
  auVar99._20_4_ = auVar94._20_4_ * 0.0;
  auVar99._24_4_ = auVar94._24_4_ * 0.0;
  auVar99._28_4_ = 0;
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar75 * 0xe + 6));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar9));
  auVar102._4_4_ = auVar83._4_4_ * auVar94._4_4_;
  auVar102._0_4_ = auVar83._0_4_ * auVar94._0_4_;
  auVar102._8_4_ = auVar83._8_4_ * auVar94._8_4_;
  auVar102._12_4_ = auVar83._12_4_ * auVar94._12_4_;
  auVar102._16_4_ = auVar94._16_4_ * 0.0;
  auVar102._20_4_ = auVar94._20_4_ * 0.0;
  auVar102._24_4_ = auVar94._24_4_ * 0.0;
  auVar102._28_4_ = auVar94._28_4_;
  auVar95 = vpbroadcastd_avx512vl();
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar9));
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar75 * 0x15 + 6));
  auVar98._0_4_ = auVar83._0_4_ * auVar94._0_4_;
  auVar98._4_4_ = auVar83._4_4_ * auVar94._4_4_;
  auVar98._8_4_ = auVar83._8_4_ * auVar94._8_4_;
  auVar98._12_4_ = auVar83._12_4_ * auVar94._12_4_;
  auVar98._16_4_ = auVar94._16_4_ * 0.0;
  auVar98._20_4_ = auVar94._20_4_ * 0.0;
  auVar98._24_4_ = auVar94._24_4_ * 0.0;
  auVar98._28_4_ = 0;
  auVar94 = vcvtdq2ps_avx(auVar91);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar10));
  auVar97._4_4_ = auVar94._4_4_ * auVar82._4_4_;
  auVar97._0_4_ = auVar94._0_4_ * auVar82._0_4_;
  auVar97._8_4_ = auVar94._8_4_ * auVar82._8_4_;
  auVar97._12_4_ = auVar94._12_4_ * auVar82._12_4_;
  auVar97._16_4_ = auVar94._16_4_ * 0.0;
  auVar97._20_4_ = auVar94._20_4_ * 0.0;
  auVar97._24_4_ = auVar94._24_4_ * 0.0;
  auVar97._28_4_ = auVar94._28_4_;
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar75 * 0x17 + 6));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar10));
  auVar88._0_4_ = auVar82._0_4_ * auVar94._0_4_;
  auVar88._4_4_ = auVar82._4_4_ * auVar94._4_4_;
  auVar88._8_4_ = auVar82._8_4_ * auVar94._8_4_;
  auVar88._12_4_ = auVar82._12_4_ * auVar94._12_4_;
  auVar88._16_4_ = auVar94._16_4_ * 0.0;
  auVar88._20_4_ = auVar94._20_4_ * 0.0;
  auVar88._24_4_ = auVar94._24_4_ * 0.0;
  auVar88._28_4_ = 0;
  auVar94 = vpminsd_avx2(auVar103,auVar99);
  auVar91 = vpminsd_avx2(auVar102,auVar98);
  auVar94 = vmaxps_avx(auVar94,auVar91);
  auVar91 = vpminsd_avx2(auVar97,auVar88);
  uVar136 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar92._4_4_ = uVar136;
  auVar92._0_4_ = uVar136;
  auVar92._8_4_ = uVar136;
  auVar92._12_4_ = uVar136;
  auVar92._16_4_ = uVar136;
  auVar92._20_4_ = uVar136;
  auVar92._24_4_ = uVar136;
  auVar92._28_4_ = uVar136;
  auVar91 = vmaxps_avx512vl(auVar91,auVar92);
  auVar94 = vmaxps_avx(auVar94,auVar91);
  auVar91._8_4_ = 0x3f7ffffa;
  auVar91._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar91._12_4_ = 0x3f7ffffa;
  auVar91._16_4_ = 0x3f7ffffa;
  auVar91._20_4_ = 0x3f7ffffa;
  auVar91._24_4_ = 0x3f7ffffa;
  auVar91._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar94,auVar91);
  auVar94 = vpmaxsd_avx2(auVar103,auVar99);
  auVar91 = vpmaxsd_avx2(auVar102,auVar98);
  auVar94 = vminps_avx(auVar94,auVar91);
  auVar91 = vpmaxsd_avx2(auVar97,auVar88);
  fVar159 = ray->tfar;
  auVar93._4_4_ = fVar159;
  auVar93._0_4_ = fVar159;
  auVar93._8_4_ = fVar159;
  auVar93._12_4_ = fVar159;
  auVar93._16_4_ = fVar159;
  auVar93._20_4_ = fVar159;
  auVar93._24_4_ = fVar159;
  auVar93._28_4_ = fVar159;
  auVar91 = vminps_avx512vl(auVar91,auVar93);
  auVar94 = vminps_avx(auVar94,auVar91);
  auVar96._8_4_ = 0x3f800003;
  auVar96._0_8_ = 0x3f8000033f800003;
  auVar96._12_4_ = 0x3f800003;
  auVar96._16_4_ = 0x3f800003;
  auVar96._20_4_ = 0x3f800003;
  auVar96._24_4_ = 0x3f800003;
  auVar96._28_4_ = 0x3f800003;
  auVar94 = vmulps_avx512vl(auVar94,auVar96);
  uVar140 = vcmpps_avx512vl(local_80,auVar94,2);
  uVar23 = vpcmpgtd_avx512vl(auVar95,_DAT_01fb4ba0);
  local_3a8 = CONCAT44((int)((ulong)unaff_R12 >> 0x20),(uint)(byte)((byte)uVar140 & (byte)uVar23));
  local_538 = ray;
  local_540 = prim;
  while (local_3a8 != 0) {
    lVar76 = 0;
    for (uVar72 = local_3a8; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x8000000000000000) {
      lVar76 = lVar76 + 1;
    }
    local_530 = (ulong)*(uint *)(local_540 + 2);
    pGVar14 = (context->scene->geometries).items[*(uint *)(local_540 + 2)].ptr;
    local_488 = (ulong)*(uint *)(local_540 + lVar76 * 4 + 6);
    uVar72 = (ulong)*(uint *)(*(long *)&pGVar14->field_0x58 +
                             pGVar14[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>
                             ._M_i * (ulong)*(uint *)(local_540 + lVar76 * 4 + 6));
    p_Var15 = pGVar14[1].intersectionFilterN;
    lVar76 = *(long *)&pGVar14[1].time_range.upper;
    local_3f0 = *(undefined1 (*) [16])(lVar76 + (long)p_Var15 * uVar72);
    local_400 = *(undefined1 (*) [16])(lVar76 + (uVar72 + 1) * (long)p_Var15);
    pauVar3 = (undefined1 (*) [16])(lVar76 + (uVar72 + 2) * (long)p_Var15);
    auVar81 = *pauVar3;
    local_510 = *(undefined8 *)*pauVar3;
    uStack_508 = *(undefined8 *)(*pauVar3 + 8);
    uVar75 = local_3a8 - 1 & local_3a8;
    pauVar4 = (undefined1 (*) [12])(lVar76 + (uVar72 + 3) * (long)p_Var15);
    local_3c0 = (float)*(undefined8 *)*pauVar4;
    fStack_3bc = (float)((ulong)*(undefined8 *)*pauVar4 >> 0x20);
    fStack_3b8 = (float)*(undefined8 *)(*pauVar4 + 8);
    fStack_3b4 = (float)((ulong)*(undefined8 *)(*pauVar4 + 8) >> 0x20);
    if (uVar75 != 0) {
      uVar73 = uVar75 - 1 & uVar75;
      for (uVar72 = uVar75; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x8000000000000000) {
      }
      if (uVar73 != 0) {
        for (; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x8000000000000000) {
        }
      }
    }
    iVar13 = (int)pGVar14[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    aVar5 = (local_538->org).field_0;
    auVar82 = vsubps_avx(local_3f0,(undefined1  [16])aVar5);
    uVar136 = auVar82._0_4_;
    auVar84._4_4_ = uVar136;
    auVar84._0_4_ = uVar136;
    auVar84._8_4_ = uVar136;
    auVar84._12_4_ = uVar136;
    auVar83 = vshufps_avx(auVar82,auVar82,0x55);
    aVar6 = (local_520->ray_space).vx.field_0;
    aVar7 = (local_520->ray_space).vy.field_0;
    fVar159 = (local_520->ray_space).vz.field_0.m128[0];
    fVar142 = (local_520->ray_space).vz.field_0.m128[1];
    fVar139 = (local_520->ray_space).vz.field_0.m128[2];
    fVar78 = (local_520->ray_space).vz.field_0.m128[3];
    auVar82 = vshufps_avx(auVar82,auVar82,0xaa);
    auVar163._0_4_ = auVar82._0_4_ * fVar159;
    auVar163._4_4_ = auVar82._4_4_ * fVar142;
    auVar163._8_4_ = auVar82._8_4_ * fVar139;
    auVar163._12_4_ = auVar82._12_4_ * fVar78;
    auVar83 = vfmadd231ps_fma(auVar163,(undefined1  [16])aVar7,auVar83);
    auVar10 = vfmadd231ps_fma(auVar83,(undefined1  [16])aVar6,auVar84);
    auVar83 = vshufps_avx(local_3f0,local_3f0,0xff);
    auVar8 = vsubps_avx(local_400,(undefined1  [16])aVar5);
    uVar136 = auVar8._0_4_;
    auVar143._4_4_ = uVar136;
    auVar143._0_4_ = uVar136;
    auVar143._8_4_ = uVar136;
    auVar143._12_4_ = uVar136;
    auVar82 = vshufps_avx(auVar8,auVar8,0x55);
    auVar8 = vshufps_avx(auVar8,auVar8,0xaa);
    auVar165._0_4_ = auVar8._0_4_ * fVar159;
    auVar165._4_4_ = auVar8._4_4_ * fVar142;
    auVar165._8_4_ = auVar8._8_4_ * fVar139;
    auVar165._12_4_ = auVar8._12_4_ * fVar78;
    auVar82 = vfmadd231ps_fma(auVar165,(undefined1  [16])aVar7,auVar82);
    auVar11 = vfmadd231ps_fma(auVar82,(undefined1  [16])aVar6,auVar143);
    auVar82 = vshufps_avx(local_400,local_400,0xff);
    auVar9 = vsubps_avx(auVar81,(undefined1  [16])aVar5);
    uVar136 = auVar9._0_4_;
    auVar160._4_4_ = uVar136;
    auVar160._0_4_ = uVar136;
    auVar160._8_4_ = uVar136;
    auVar160._12_4_ = uVar136;
    auVar8 = vshufps_avx(auVar9,auVar9,0x55);
    auVar9 = vshufps_avx(auVar9,auVar9,0xaa);
    auVar167._0_4_ = auVar9._0_4_ * fVar159;
    auVar167._4_4_ = auVar9._4_4_ * fVar142;
    auVar167._8_4_ = auVar9._8_4_ * fVar139;
    auVar167._12_4_ = auVar9._12_4_ * fVar78;
    auVar8 = vfmadd231ps_fma(auVar167,(undefined1  [16])aVar7,auVar8);
    auVar9 = vfmadd231ps_fma(auVar8,(undefined1  [16])aVar6,auVar160);
    auVar80 = vshufps_avx512vl(auVar81,auVar81,0xff);
    auVar22._12_4_ = fStack_3b4;
    auVar22._0_12_ = *pauVar4;
    local_300 = ZEXT1632((undefined1  [16])aVar5);
    auVar8 = vsubps_avx(auVar22,(undefined1  [16])aVar5);
    uVar136 = auVar8._0_4_;
    auVar161._4_4_ = uVar136;
    auVar161._0_4_ = uVar136;
    auVar161._8_4_ = uVar136;
    auVar161._12_4_ = uVar136;
    auVar81 = vshufps_avx(auVar8,auVar8,0x55);
    auVar8 = vshufps_avx(auVar8,auVar8,0xaa);
    auVar168._0_4_ = auVar8._0_4_ * fVar159;
    auVar168._4_4_ = auVar8._4_4_ * fVar142;
    auVar168._8_4_ = auVar8._8_4_ * fVar139;
    auVar168._12_4_ = auVar8._12_4_ * fVar78;
    auVar81 = vfmadd231ps_fma(auVar168,(undefined1  [16])aVar7,auVar81);
    auVar8 = vfmadd231ps_fma(auVar81,(undefined1  [16])aVar6,auVar161);
    local_548 = (long)iVar13;
    lVar76 = local_548 * 0x44;
    auVar94 = *(undefined1 (*) [32])(bezier_basis0 + lVar76);
    uVar136 = auVar10._0_4_;
    local_340._4_4_ = uVar136;
    local_340._0_4_ = uVar136;
    local_340._8_4_ = uVar136;
    local_340._12_4_ = uVar136;
    local_340._16_4_ = uVar136;
    local_340._20_4_ = uVar136;
    local_340._24_4_ = uVar136;
    local_340._28_4_ = uVar136;
    auVar137._8_4_ = 1;
    auVar137._0_8_ = 0x100000001;
    auVar137._12_4_ = 1;
    auVar137._16_4_ = 1;
    auVar137._20_4_ = 1;
    auVar137._24_4_ = 1;
    auVar137._28_4_ = 1;
    local_360 = vpermps_avx512vl(auVar137,ZEXT1632(auVar10));
    auVar91 = *(undefined1 (*) [32])(bezier_basis0 + lVar76 + 0x484);
    local_3a0 = vbroadcastss_avx512vl(auVar11);
    local_380 = vpermps_avx512vl(auVar137,ZEXT1632(auVar11));
    auVar92 = *(undefined1 (*) [32])(bezier_basis0 + lVar76 + 0x908);
    local_440 = vbroadcastss_avx512vl(auVar9);
    local_460 = vpermps_avx512vl(auVar137,ZEXT1632(auVar9));
    auVar93 = *(undefined1 (*) [32])(bezier_basis0 + lVar76 + 0xd8c);
    fVar159 = auVar8._0_4_;
    local_3e0._4_4_ = fVar159;
    local_3e0._0_4_ = fVar159;
    local_3e0._8_4_ = fVar159;
    local_3e0._12_4_ = fVar159;
    local_3e0._16_4_ = fVar159;
    local_3e0._20_4_ = fVar159;
    local_3e0._24_4_ = fVar159;
    local_3e0._28_4_ = fVar159;
    local_480 = vpermps_avx512vl(auVar137,ZEXT1632(auVar8));
    auVar96 = vmulps_avx512vl(local_3e0,auVar93);
    auVar95 = vmulps_avx512vl(local_480,auVar93);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar92,local_440);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar92,local_460);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar91,local_3a0);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar91,local_380);
    auVar97 = vfmadd231ps_avx512vl(auVar96,auVar94,local_340);
    auVar89 = vfmadd231ps_avx512vl(auVar95,auVar94,local_360);
    auVar96 = *(undefined1 (*) [32])(bezier_basis1 + lVar76);
    auVar95 = *(undefined1 (*) [32])(bezier_basis1 + lVar76 + 0x484);
    auVar103 = *(undefined1 (*) [32])(bezier_basis1 + lVar76 + 0x908);
    auVar102 = *(undefined1 (*) [32])(bezier_basis1 + lVar76 + 0xd8c);
    auVar183 = ZEXT3264(local_3e0);
    auVar90 = vmulps_avx512vl(local_3e0,auVar102);
    auVar85 = vmulps_avx512vl(local_480,auVar102);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar103,local_440);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar103,local_460);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar95,local_3a0);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar95,local_380);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar96,local_340);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar96,local_360);
    auVar86 = vsubps_avx512vl(auVar90,auVar97);
    auVar87 = vsubps_avx512vl(auVar85,auVar89);
    auVar88 = vmulps_avx512vl(auVar89,auVar86);
    auVar98 = vmulps_avx512vl(auVar97,auVar87);
    auVar88 = vsubps_avx512vl(auVar88,auVar98);
    auVar81 = vshufps_avx512vl(auVar22,auVar22,0xff);
    uVar140 = auVar83._0_8_;
    local_a0._8_8_ = uVar140;
    local_a0._0_8_ = uVar140;
    local_a0._16_8_ = uVar140;
    local_a0._24_8_ = uVar140;
    local_c0 = vbroadcastsd_avx512vl(auVar82);
    local_e0 = vbroadcastsd_avx512vl(auVar80);
    _local_100 = vbroadcastsd_avx512vl(auVar81);
    auVar98 = vmulps_avx512vl(_local_100,auVar93);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar92,local_e0);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar91,local_c0);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar94,local_a0);
    auVar99 = vmulps_avx512vl(_local_100,auVar102);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar103,local_e0);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar95,local_c0);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar96,local_a0);
    auVar100 = vmulps_avx512vl(auVar87,auVar87);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar86,auVar86);
    auVar101 = vmaxps_avx512vl(auVar98,auVar99);
    auVar101 = vmulps_avx512vl(auVar101,auVar101);
    auVar100 = vmulps_avx512vl(auVar101,auVar100);
    auVar88 = vmulps_avx512vl(auVar88,auVar88);
    uVar140 = vcmpps_avx512vl(auVar88,auVar100,2);
    auVar81 = vblendps_avx(auVar10,local_3f0,8);
    auVar82 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar83 = vandps_avx512vl(auVar81,auVar82);
    auVar81 = vblendps_avx(auVar11,local_400,8);
    auVar81 = vandps_avx512vl(auVar81,auVar82);
    auVar83 = vmaxps_avx(auVar83,auVar81);
    auVar81 = vblendps_avx(auVar9,*pauVar3,8);
    auVar80 = vandps_avx512vl(auVar81,auVar82);
    auVar81 = vblendps_avx(auVar8,auVar22,8);
    auVar81 = vandps_avx512vl(auVar81,auVar82);
    auVar81 = vmaxps_avx(auVar80,auVar81);
    auVar81 = vmaxps_avx(auVar83,auVar81);
    auVar83 = vmovshdup_avx(auVar81);
    auVar83 = vmaxss_avx(auVar83,auVar81);
    auVar81 = vshufpd_avx(auVar81,auVar81,1);
    auVar81 = vmaxss_avx(auVar81,auVar83);
    local_320._0_4_ = (undefined4)iVar13;
    register0x00001504 = auVar10._4_12_;
    auVar169._4_4_ = local_320._0_4_;
    auVar169._0_4_ = local_320._0_4_;
    auVar169._8_4_ = local_320._0_4_;
    auVar169._12_4_ = local_320._0_4_;
    auVar169._16_4_ = local_320._0_4_;
    auVar169._20_4_ = local_320._0_4_;
    auVar169._24_4_ = local_320._0_4_;
    auVar169._28_4_ = local_320._0_4_;
    uVar23 = vcmpps_avx512vl(auVar169,_DAT_01f7b060,0xe);
    bVar77 = (byte)uVar140 & (byte)uVar23;
    auVar81 = vmulss_avx512f(auVar81,ZEXT416(0x35000000));
    auVar151._8_4_ = 2;
    auVar151._0_8_ = 0x200000002;
    auVar151._12_4_ = 2;
    auVar151._16_4_ = 2;
    auVar151._20_4_ = 2;
    auVar151._24_4_ = 2;
    auVar151._28_4_ = 2;
    local_120 = vpermps_avx2(auVar151,ZEXT1632(auVar10));
    local_140 = vpermps_avx512vl(auVar151,ZEXT1632(auVar11));
    local_160 = vpermps_avx512vl(auVar151,ZEXT1632(auVar9));
    local_180 = vpermps_avx512vl(auVar151,ZEXT1632(auVar8));
    if (bVar77 == 0) {
      bVar74 = false;
      auVar83 = vxorps_avx512vl(auVar103._0_16_,auVar103._0_16_);
      auVar174 = ZEXT1664(auVar83);
      auVar175 = ZEXT3264(local_340);
      auVar178 = ZEXT3264(local_360);
      auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar182 = ZEXT3264(auVar94);
      auVar176 = ZEXT3264(local_3a0);
      auVar181 = ZEXT3264(local_380);
      auVar177 = ZEXT3264(local_440);
      auVar179 = ZEXT3264(local_460);
      auVar180 = ZEXT3264(local_480);
    }
    else {
      auVar102 = vmulps_avx512vl(local_180,auVar102);
      auVar103 = vfmadd213ps_avx512vl(auVar103,local_160,auVar102);
      auVar95 = vfmadd213ps_avx512vl(auVar95,local_140,auVar103);
      auVar95 = vfmadd213ps_avx512vl(auVar96,local_120,auVar95);
      auVar93 = vmulps_avx512vl(local_180,auVar93);
      auVar92 = vfmadd213ps_avx512vl(auVar92,local_160,auVar93);
      auVar102 = vfmadd213ps_avx512vl(auVar91,local_140,auVar92);
      auVar91 = *(undefined1 (*) [32])(bezier_basis0 + lVar76 + 0x1210);
      auVar92 = *(undefined1 (*) [32])(bezier_basis0 + lVar76 + 0x1694);
      auVar93 = *(undefined1 (*) [32])(bezier_basis0 + lVar76 + 0x1b18);
      auVar96 = *(undefined1 (*) [32])(bezier_basis0 + lVar76 + 0x1f9c);
      auVar102 = vfmadd213ps_avx512vl(auVar94,local_120,auVar102);
      auVar94 = vmulps_avx512vl(local_3e0,auVar96);
      auVar31._4_4_ = auVar96._4_4_ * local_480._4_4_;
      auVar31._0_4_ = auVar96._0_4_ * local_480._0_4_;
      auVar31._8_4_ = auVar96._8_4_ * local_480._8_4_;
      auVar31._12_4_ = auVar96._12_4_ * local_480._12_4_;
      auVar31._16_4_ = auVar96._16_4_ * local_480._16_4_;
      auVar31._20_4_ = auVar96._20_4_ * local_480._20_4_;
      auVar31._24_4_ = auVar96._24_4_ * local_480._24_4_;
      auVar31._28_4_ = local_120._28_4_;
      auVar96 = vmulps_avx512vl(local_180,auVar96);
      auVar94 = vfmadd231ps_avx512vl(auVar94,auVar93,local_440);
      auVar88 = vfmadd231ps_avx512vl(auVar31,auVar93,local_460);
      auVar93 = vfmadd231ps_avx512vl(auVar96,local_160,auVar93);
      auVar94 = vfmadd231ps_avx512vl(auVar94,auVar92,local_3a0);
      auVar96 = vfmadd231ps_avx512vl(auVar88,auVar92,local_380);
      auVar88 = vfmadd231ps_avx512vl(auVar93,local_140,auVar92);
      auVar175 = ZEXT3264(local_340);
      auVar100 = vfmadd231ps_avx512vl(auVar94,auVar91,local_340);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar91,local_360);
      auVar94 = *(undefined1 (*) [32])(bezier_basis1 + lVar76 + 0x1210);
      auVar92 = *(undefined1 (*) [32])(bezier_basis1 + lVar76 + 0x1b18);
      auVar93 = *(undefined1 (*) [32])(bezier_basis1 + lVar76 + 0x1f9c);
      auVar83 = vfmadd231ps_fma(auVar88,local_120,auVar91);
      auVar32._4_4_ = fVar159 * auVar93._4_4_;
      auVar32._0_4_ = fVar159 * auVar93._0_4_;
      auVar32._8_4_ = fVar159 * auVar93._8_4_;
      auVar32._12_4_ = fVar159 * auVar93._12_4_;
      auVar32._16_4_ = fVar159 * auVar93._16_4_;
      auVar32._20_4_ = fVar159 * auVar93._20_4_;
      auVar32._24_4_ = fVar159 * auVar93._24_4_;
      auVar32._28_4_ = auVar91._28_4_;
      auVar33._4_4_ = auVar93._4_4_ * local_480._4_4_;
      auVar33._0_4_ = auVar93._0_4_ * local_480._0_4_;
      auVar33._8_4_ = auVar93._8_4_ * local_480._8_4_;
      auVar33._12_4_ = auVar93._12_4_ * local_480._12_4_;
      auVar33._16_4_ = auVar93._16_4_ * local_480._16_4_;
      auVar33._20_4_ = auVar93._20_4_ * local_480._20_4_;
      auVar33._24_4_ = auVar93._24_4_ * local_480._24_4_;
      auVar33._28_4_ = fVar159;
      auVar91 = vmulps_avx512vl(local_180,auVar93);
      auVar93 = vfmadd231ps_avx512vl(auVar32,auVar92,local_440);
      auVar88 = vfmadd231ps_avx512vl(auVar33,auVar92,local_460);
      auVar92 = vfmadd231ps_avx512vl(auVar91,local_160,auVar92);
      auVar91 = *(undefined1 (*) [32])(bezier_basis1 + lVar76 + 0x1694);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar91,local_3a0);
      auVar88 = vfmadd231ps_avx512vl(auVar88,auVar91,local_380);
      auVar91 = vfmadd231ps_avx512vl(auVar92,local_140,auVar91);
      auVar92 = vfmadd231ps_avx512vl(auVar93,auVar94,local_340);
      auVar93 = vfmadd231ps_avx512vl(auVar88,auVar94,local_360);
      auVar82 = vfmadd231ps_fma(auVar91,local_120,auVar94);
      auVar172._8_4_ = 0x7fffffff;
      auVar172._0_8_ = 0x7fffffff7fffffff;
      auVar172._12_4_ = 0x7fffffff;
      auVar172._16_4_ = 0x7fffffff;
      auVar172._20_4_ = 0x7fffffff;
      auVar172._24_4_ = 0x7fffffff;
      auVar172._28_4_ = 0x7fffffff;
      auVar94 = vandps_avx(auVar100,auVar172);
      auVar91 = vandps_avx(auVar96,auVar172);
      auVar91 = vmaxps_avx(auVar94,auVar91);
      auVar94 = vandps_avx(ZEXT1632(auVar83),auVar172);
      auVar94 = vmaxps_avx(auVar91,auVar94);
      auVar88 = vbroadcastss_avx512vl(auVar81);
      uVar72 = vcmpps_avx512vl(auVar94,auVar88,1);
      bVar74 = (bool)((byte)uVar72 & 1);
      auVar104._0_4_ = (float)((uint)bVar74 * auVar86._0_4_ | (uint)!bVar74 * auVar100._0_4_);
      bVar74 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar104._4_4_ = (float)((uint)bVar74 * auVar86._4_4_ | (uint)!bVar74 * auVar100._4_4_);
      bVar74 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar104._8_4_ = (float)((uint)bVar74 * auVar86._8_4_ | (uint)!bVar74 * auVar100._8_4_);
      bVar74 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar104._12_4_ = (float)((uint)bVar74 * auVar86._12_4_ | (uint)!bVar74 * auVar100._12_4_);
      bVar74 = (bool)((byte)(uVar72 >> 4) & 1);
      auVar104._16_4_ = (float)((uint)bVar74 * auVar86._16_4_ | (uint)!bVar74 * auVar100._16_4_);
      bVar74 = (bool)((byte)(uVar72 >> 5) & 1);
      auVar104._20_4_ = (float)((uint)bVar74 * auVar86._20_4_ | (uint)!bVar74 * auVar100._20_4_);
      bVar74 = (bool)((byte)(uVar72 >> 6) & 1);
      auVar104._24_4_ = (float)((uint)bVar74 * auVar86._24_4_ | (uint)!bVar74 * auVar100._24_4_);
      bVar74 = SUB81(uVar72 >> 7,0);
      auVar104._28_4_ = (uint)bVar74 * auVar86._28_4_ | (uint)!bVar74 * auVar100._28_4_;
      bVar74 = (bool)((byte)uVar72 & 1);
      auVar105._0_4_ = (float)((uint)bVar74 * auVar87._0_4_ | (uint)!bVar74 * auVar96._0_4_);
      bVar74 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar105._4_4_ = (float)((uint)bVar74 * auVar87._4_4_ | (uint)!bVar74 * auVar96._4_4_);
      bVar74 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar105._8_4_ = (float)((uint)bVar74 * auVar87._8_4_ | (uint)!bVar74 * auVar96._8_4_);
      bVar74 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar105._12_4_ = (float)((uint)bVar74 * auVar87._12_4_ | (uint)!bVar74 * auVar96._12_4_);
      bVar74 = (bool)((byte)(uVar72 >> 4) & 1);
      auVar105._16_4_ = (float)((uint)bVar74 * auVar87._16_4_ | (uint)!bVar74 * auVar96._16_4_);
      bVar74 = (bool)((byte)(uVar72 >> 5) & 1);
      auVar105._20_4_ = (float)((uint)bVar74 * auVar87._20_4_ | (uint)!bVar74 * auVar96._20_4_);
      bVar74 = (bool)((byte)(uVar72 >> 6) & 1);
      auVar105._24_4_ = (float)((uint)bVar74 * auVar87._24_4_ | (uint)!bVar74 * auVar96._24_4_);
      bVar74 = SUB81(uVar72 >> 7,0);
      auVar105._28_4_ = (uint)bVar74 * auVar87._28_4_ | (uint)!bVar74 * auVar96._28_4_;
      auVar94 = vandps_avx(auVar172,auVar92);
      auVar91 = vandps_avx(auVar93,auVar172);
      auVar91 = vmaxps_avx(auVar94,auVar91);
      auVar94 = vandps_avx(ZEXT1632(auVar82),auVar172);
      auVar94 = vmaxps_avx(auVar91,auVar94);
      uVar72 = vcmpps_avx512vl(auVar94,auVar88,1);
      bVar74 = (bool)((byte)uVar72 & 1);
      auVar106._0_4_ = (float)((uint)bVar74 * auVar86._0_4_ | (uint)!bVar74 * auVar92._0_4_);
      bVar74 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar106._4_4_ = (float)((uint)bVar74 * auVar86._4_4_ | (uint)!bVar74 * auVar92._4_4_);
      bVar74 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar106._8_4_ = (float)((uint)bVar74 * auVar86._8_4_ | (uint)!bVar74 * auVar92._8_4_);
      bVar74 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar106._12_4_ = (float)((uint)bVar74 * auVar86._12_4_ | (uint)!bVar74 * auVar92._12_4_);
      bVar74 = (bool)((byte)(uVar72 >> 4) & 1);
      auVar106._16_4_ = (float)((uint)bVar74 * auVar86._16_4_ | (uint)!bVar74 * auVar92._16_4_);
      bVar74 = (bool)((byte)(uVar72 >> 5) & 1);
      auVar106._20_4_ = (float)((uint)bVar74 * auVar86._20_4_ | (uint)!bVar74 * auVar92._20_4_);
      bVar74 = (bool)((byte)(uVar72 >> 6) & 1);
      auVar106._24_4_ = (float)((uint)bVar74 * auVar86._24_4_ | (uint)!bVar74 * auVar92._24_4_);
      bVar74 = SUB81(uVar72 >> 7,0);
      auVar106._28_4_ = (uint)bVar74 * auVar86._28_4_ | (uint)!bVar74 * auVar92._28_4_;
      bVar74 = (bool)((byte)uVar72 & 1);
      auVar107._0_4_ = (float)((uint)bVar74 * auVar87._0_4_ | (uint)!bVar74 * auVar93._0_4_);
      bVar74 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar107._4_4_ = (float)((uint)bVar74 * auVar87._4_4_ | (uint)!bVar74 * auVar93._4_4_);
      bVar74 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar107._8_4_ = (float)((uint)bVar74 * auVar87._8_4_ | (uint)!bVar74 * auVar93._8_4_);
      bVar74 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar107._12_4_ = (float)((uint)bVar74 * auVar87._12_4_ | (uint)!bVar74 * auVar93._12_4_);
      bVar74 = (bool)((byte)(uVar72 >> 4) & 1);
      auVar107._16_4_ = (float)((uint)bVar74 * auVar87._16_4_ | (uint)!bVar74 * auVar93._16_4_);
      bVar74 = (bool)((byte)(uVar72 >> 5) & 1);
      auVar107._20_4_ = (float)((uint)bVar74 * auVar87._20_4_ | (uint)!bVar74 * auVar93._20_4_);
      bVar74 = (bool)((byte)(uVar72 >> 6) & 1);
      auVar107._24_4_ = (float)((uint)bVar74 * auVar87._24_4_ | (uint)!bVar74 * auVar93._24_4_);
      bVar74 = SUB81(uVar72 >> 7,0);
      auVar107._28_4_ = (uint)bVar74 * auVar87._28_4_ | (uint)!bVar74 * auVar93._28_4_;
      auVar84 = vxorps_avx512vl(auVar103._0_16_,auVar103._0_16_);
      auVar174 = ZEXT1664(auVar84);
      auVar94 = vfmadd213ps_avx512vl(auVar104,auVar104,ZEXT1632(auVar84));
      auVar83 = vfmadd231ps_fma(auVar94,auVar105,auVar105);
      auVar94 = vrsqrt14ps_avx512vl(ZEXT1632(auVar83));
      fVar159 = auVar94._0_4_;
      fVar142 = auVar94._4_4_;
      fVar139 = auVar94._8_4_;
      fVar78 = auVar94._12_4_;
      fVar79 = auVar94._16_4_;
      fVar125 = auVar94._20_4_;
      fVar126 = auVar94._24_4_;
      auVar34._4_4_ = fVar142 * fVar142 * fVar142 * auVar83._4_4_ * -0.5;
      auVar34._0_4_ = fVar159 * fVar159 * fVar159 * auVar83._0_4_ * -0.5;
      auVar34._8_4_ = fVar139 * fVar139 * fVar139 * auVar83._8_4_ * -0.5;
      auVar34._12_4_ = fVar78 * fVar78 * fVar78 * auVar83._12_4_ * -0.5;
      auVar34._16_4_ = fVar79 * fVar79 * fVar79 * -0.0;
      auVar34._20_4_ = fVar125 * fVar125 * fVar125 * -0.0;
      auVar34._24_4_ = fVar126 * fVar126 * fVar126 * -0.0;
      auVar34._28_4_ = 0;
      auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar92 = vfmadd231ps_avx512vl(auVar34,auVar91,auVar94);
      auVar35._4_4_ = auVar105._4_4_ * auVar92._4_4_;
      auVar35._0_4_ = auVar105._0_4_ * auVar92._0_4_;
      auVar35._8_4_ = auVar105._8_4_ * auVar92._8_4_;
      auVar35._12_4_ = auVar105._12_4_ * auVar92._12_4_;
      auVar35._16_4_ = auVar105._16_4_ * auVar92._16_4_;
      auVar35._20_4_ = auVar105._20_4_ * auVar92._20_4_;
      auVar35._24_4_ = auVar105._24_4_ * auVar92._24_4_;
      auVar35._28_4_ = auVar94._28_4_;
      auVar36._4_4_ = auVar92._4_4_ * -auVar104._4_4_;
      auVar36._0_4_ = auVar92._0_4_ * -auVar104._0_4_;
      auVar36._8_4_ = auVar92._8_4_ * -auVar104._8_4_;
      auVar36._12_4_ = auVar92._12_4_ * -auVar104._12_4_;
      auVar36._16_4_ = auVar92._16_4_ * -auVar104._16_4_;
      auVar36._20_4_ = auVar92._20_4_ * -auVar104._20_4_;
      auVar36._24_4_ = auVar92._24_4_ * -auVar104._24_4_;
      auVar36._28_4_ = auVar104._28_4_ ^ 0x80000000;
      auVar94 = vmulps_avx512vl(auVar92,ZEXT1632(auVar84));
      auVar86 = ZEXT1632(auVar84);
      auVar93 = vfmadd213ps_avx512vl(auVar106,auVar106,auVar86);
      auVar83 = vfmadd231ps_fma(auVar93,auVar107,auVar107);
      auVar93 = vrsqrt14ps_avx512vl(ZEXT1632(auVar83));
      fVar159 = auVar93._0_4_;
      fVar142 = auVar93._4_4_;
      fVar139 = auVar93._8_4_;
      fVar78 = auVar93._12_4_;
      fVar79 = auVar93._16_4_;
      fVar125 = auVar93._20_4_;
      fVar126 = auVar93._24_4_;
      auVar37._4_4_ = fVar142 * fVar142 * fVar142 * auVar83._4_4_ * -0.5;
      auVar37._0_4_ = fVar159 * fVar159 * fVar159 * auVar83._0_4_ * -0.5;
      auVar37._8_4_ = fVar139 * fVar139 * fVar139 * auVar83._8_4_ * -0.5;
      auVar37._12_4_ = fVar78 * fVar78 * fVar78 * auVar83._12_4_ * -0.5;
      auVar37._16_4_ = fVar79 * fVar79 * fVar79 * -0.0;
      auVar37._20_4_ = fVar125 * fVar125 * fVar125 * -0.0;
      auVar37._24_4_ = fVar126 * fVar126 * fVar126 * -0.0;
      auVar37._28_4_ = 0;
      auVar91 = vfmadd231ps_avx512vl(auVar37,auVar91,auVar93);
      auVar38._4_4_ = auVar107._4_4_ * auVar91._4_4_;
      auVar38._0_4_ = auVar107._0_4_ * auVar91._0_4_;
      auVar38._8_4_ = auVar107._8_4_ * auVar91._8_4_;
      auVar38._12_4_ = auVar107._12_4_ * auVar91._12_4_;
      auVar38._16_4_ = auVar107._16_4_ * auVar91._16_4_;
      auVar38._20_4_ = auVar107._20_4_ * auVar91._20_4_;
      auVar38._24_4_ = auVar107._24_4_ * auVar91._24_4_;
      auVar38._28_4_ = auVar93._28_4_;
      auVar39._4_4_ = -auVar106._4_4_ * auVar91._4_4_;
      auVar39._0_4_ = -auVar106._0_4_ * auVar91._0_4_;
      auVar39._8_4_ = -auVar106._8_4_ * auVar91._8_4_;
      auVar39._12_4_ = -auVar106._12_4_ * auVar91._12_4_;
      auVar39._16_4_ = -auVar106._16_4_ * auVar91._16_4_;
      auVar39._20_4_ = -auVar106._20_4_ * auVar91._20_4_;
      auVar39._24_4_ = -auVar106._24_4_ * auVar91._24_4_;
      auVar39._28_4_ = auVar92._28_4_;
      auVar91 = vmulps_avx512vl(auVar91,auVar86);
      auVar83 = vfmadd213ps_fma(auVar35,auVar98,auVar97);
      auVar82 = vfmadd213ps_fma(auVar36,auVar98,auVar89);
      auVar92 = vfmadd213ps_avx512vl(auVar94,auVar98,auVar102);
      auVar93 = vfmadd213ps_avx512vl(auVar38,auVar99,auVar90);
      auVar11 = vfnmadd213ps_fma(auVar35,auVar98,auVar97);
      auVar8 = vfmadd213ps_fma(auVar39,auVar99,auVar85);
      auVar80 = vfnmadd213ps_fma(auVar36,auVar98,auVar89);
      auVar96 = vfmadd213ps_avx512vl(auVar91,auVar99,auVar95);
      auVar103 = vfnmadd231ps_avx512vl(auVar102,auVar98,auVar94);
      auVar12 = vfnmadd213ps_fma(auVar38,auVar99,auVar90);
      auVar22 = vfnmadd213ps_fma(auVar39,auVar99,auVar85);
      auVar91 = vfnmadd231ps_avx512vl(auVar95,auVar99,auVar91);
      auVar95 = vsubps_avx512vl(auVar93,ZEXT1632(auVar11));
      auVar94 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar80));
      auVar102 = vsubps_avx512vl(auVar96,auVar103);
      auVar97 = vmulps_avx512vl(auVar94,auVar103);
      auVar9 = vfmsub231ps_fma(auVar97,ZEXT1632(auVar80),auVar102);
      auVar40._4_4_ = auVar11._4_4_ * auVar102._4_4_;
      auVar40._0_4_ = auVar11._0_4_ * auVar102._0_4_;
      auVar40._8_4_ = auVar11._8_4_ * auVar102._8_4_;
      auVar40._12_4_ = auVar11._12_4_ * auVar102._12_4_;
      auVar40._16_4_ = auVar102._16_4_ * 0.0;
      auVar40._20_4_ = auVar102._20_4_ * 0.0;
      auVar40._24_4_ = auVar102._24_4_ * 0.0;
      auVar40._28_4_ = auVar102._28_4_;
      auVar102 = vfmsub231ps_avx512vl(auVar40,auVar103,auVar95);
      auVar41._4_4_ = auVar80._4_4_ * auVar95._4_4_;
      auVar41._0_4_ = auVar80._0_4_ * auVar95._0_4_;
      auVar41._8_4_ = auVar80._8_4_ * auVar95._8_4_;
      auVar41._12_4_ = auVar80._12_4_ * auVar95._12_4_;
      auVar41._16_4_ = auVar95._16_4_ * 0.0;
      auVar41._20_4_ = auVar95._20_4_ * 0.0;
      auVar41._24_4_ = auVar95._24_4_ * 0.0;
      auVar41._28_4_ = auVar95._28_4_;
      auVar10 = vfmsub231ps_fma(auVar41,ZEXT1632(auVar11),auVar94);
      auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar10),auVar86,auVar102);
      auVar94 = vfmadd231ps_avx512vl(auVar94,auVar86,ZEXT1632(auVar9));
      auVar86 = ZEXT1632(auVar84);
      uVar72 = vcmpps_avx512vl(auVar94,auVar86,2);
      bVar69 = (byte)uVar72;
      fVar78 = (float)((uint)(bVar69 & 1) * auVar83._0_4_ |
                      (uint)!(bool)(bVar69 & 1) * auVar12._0_4_);
      bVar74 = (bool)((byte)(uVar72 >> 1) & 1);
      fVar125 = (float)((uint)bVar74 * auVar83._4_4_ | (uint)!bVar74 * auVar12._4_4_);
      bVar74 = (bool)((byte)(uVar72 >> 2) & 1);
      fVar129 = (float)((uint)bVar74 * auVar83._8_4_ | (uint)!bVar74 * auVar12._8_4_);
      bVar74 = (bool)((byte)(uVar72 >> 3) & 1);
      fVar132 = (float)((uint)bVar74 * auVar83._12_4_ | (uint)!bVar74 * auVar12._12_4_);
      auVar95 = ZEXT1632(CONCAT412(fVar132,CONCAT48(fVar129,CONCAT44(fVar125,fVar78))));
      fVar79 = (float)((uint)(bVar69 & 1) * auVar82._0_4_ |
                      (uint)!(bool)(bVar69 & 1) * auVar22._0_4_);
      bVar74 = (bool)((byte)(uVar72 >> 1) & 1);
      fVar126 = (float)((uint)bVar74 * auVar82._4_4_ | (uint)!bVar74 * auVar22._4_4_);
      bVar74 = (bool)((byte)(uVar72 >> 2) & 1);
      fVar156 = (float)((uint)bVar74 * auVar82._8_4_ | (uint)!bVar74 * auVar22._8_4_);
      bVar74 = (bool)((byte)(uVar72 >> 3) & 1);
      fVar133 = (float)((uint)bVar74 * auVar82._12_4_ | (uint)!bVar74 * auVar22._12_4_);
      auVar102 = ZEXT1632(CONCAT412(fVar133,CONCAT48(fVar156,CONCAT44(fVar126,fVar79))));
      auVar108._0_4_ =
           (uint)(bVar69 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar91._0_4_;
      bVar74 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar108._4_4_ = (uint)bVar74 * auVar92._4_4_ | (uint)!bVar74 * auVar91._4_4_;
      bVar74 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar108._8_4_ = (uint)bVar74 * auVar92._8_4_ | (uint)!bVar74 * auVar91._8_4_;
      bVar74 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar108._12_4_ = (uint)bVar74 * auVar92._12_4_ | (uint)!bVar74 * auVar91._12_4_;
      bVar74 = (bool)((byte)(uVar72 >> 4) & 1);
      auVar108._16_4_ = (uint)bVar74 * auVar92._16_4_ | (uint)!bVar74 * auVar91._16_4_;
      bVar74 = (bool)((byte)(uVar72 >> 5) & 1);
      auVar108._20_4_ = (uint)bVar74 * auVar92._20_4_ | (uint)!bVar74 * auVar91._20_4_;
      bVar74 = (bool)((byte)(uVar72 >> 6) & 1);
      auVar108._24_4_ = (uint)bVar74 * auVar92._24_4_ | (uint)!bVar74 * auVar91._24_4_;
      bVar74 = SUB81(uVar72 >> 7,0);
      auVar108._28_4_ = (uint)bVar74 * auVar92._28_4_ | (uint)!bVar74 * auVar91._28_4_;
      auVar91 = vblendmps_avx512vl(ZEXT1632(auVar11),auVar93);
      auVar109._0_4_ = (uint)(bVar69 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar9._0_4_
      ;
      bVar74 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar109._4_4_ = (uint)bVar74 * auVar91._4_4_ | (uint)!bVar74 * auVar9._4_4_;
      bVar74 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar109._8_4_ = (uint)bVar74 * auVar91._8_4_ | (uint)!bVar74 * auVar9._8_4_;
      bVar74 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar109._12_4_ = (uint)bVar74 * auVar91._12_4_ | (uint)!bVar74 * auVar9._12_4_;
      auVar109._16_4_ = (uint)((byte)(uVar72 >> 4) & 1) * auVar91._16_4_;
      auVar109._20_4_ = (uint)((byte)(uVar72 >> 5) & 1) * auVar91._20_4_;
      auVar109._24_4_ = (uint)((byte)(uVar72 >> 6) & 1) * auVar91._24_4_;
      auVar109._28_4_ = (uint)(byte)(uVar72 >> 7) * auVar91._28_4_;
      auVar91 = vblendmps_avx512vl(ZEXT1632(auVar80),ZEXT1632(auVar8));
      auVar110._0_4_ =
           (float)((uint)(bVar69 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar82._0_4_);
      bVar74 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar110._4_4_ = (float)((uint)bVar74 * auVar91._4_4_ | (uint)!bVar74 * auVar82._4_4_);
      bVar74 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar110._8_4_ = (float)((uint)bVar74 * auVar91._8_4_ | (uint)!bVar74 * auVar82._8_4_);
      bVar74 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar110._12_4_ = (float)((uint)bVar74 * auVar91._12_4_ | (uint)!bVar74 * auVar82._12_4_);
      fVar159 = (float)((uint)((byte)(uVar72 >> 4) & 1) * auVar91._16_4_);
      auVar110._16_4_ = fVar159;
      fVar142 = (float)((uint)((byte)(uVar72 >> 5) & 1) * auVar91._20_4_);
      auVar110._20_4_ = fVar142;
      fVar139 = (float)((uint)((byte)(uVar72 >> 6) & 1) * auVar91._24_4_);
      auVar110._24_4_ = fVar139;
      auVar110._28_4_ = (uint)(byte)(uVar72 >> 7) * auVar91._28_4_;
      auVar91 = vblendmps_avx512vl(auVar103,auVar96);
      auVar111._0_4_ =
           (float)((uint)(bVar69 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar92._0_4_);
      bVar74 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar111._4_4_ = (float)((uint)bVar74 * auVar91._4_4_ | (uint)!bVar74 * auVar92._4_4_);
      bVar74 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar111._8_4_ = (float)((uint)bVar74 * auVar91._8_4_ | (uint)!bVar74 * auVar92._8_4_);
      bVar74 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar111._12_4_ = (float)((uint)bVar74 * auVar91._12_4_ | (uint)!bVar74 * auVar92._12_4_);
      bVar74 = (bool)((byte)(uVar72 >> 4) & 1);
      auVar111._16_4_ = (float)((uint)bVar74 * auVar91._16_4_ | (uint)!bVar74 * auVar92._16_4_);
      bVar74 = (bool)((byte)(uVar72 >> 5) & 1);
      auVar111._20_4_ = (float)((uint)bVar74 * auVar91._20_4_ | (uint)!bVar74 * auVar92._20_4_);
      bVar74 = (bool)((byte)(uVar72 >> 6) & 1);
      auVar111._24_4_ = (float)((uint)bVar74 * auVar91._24_4_ | (uint)!bVar74 * auVar92._24_4_);
      bVar74 = SUB81(uVar72 >> 7,0);
      auVar111._28_4_ = (uint)bVar74 * auVar91._28_4_ | (uint)!bVar74 * auVar92._28_4_;
      auVar112._0_4_ =
           (uint)(bVar69 & 1) * (int)auVar11._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar93._0_4_;
      bVar74 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar112._4_4_ = (uint)bVar74 * (int)auVar11._4_4_ | (uint)!bVar74 * auVar93._4_4_;
      bVar74 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar112._8_4_ = (uint)bVar74 * (int)auVar11._8_4_ | (uint)!bVar74 * auVar93._8_4_;
      bVar74 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar112._12_4_ = (uint)bVar74 * (int)auVar11._12_4_ | (uint)!bVar74 * auVar93._12_4_;
      auVar112._16_4_ = (uint)!(bool)((byte)(uVar72 >> 4) & 1) * auVar93._16_4_;
      auVar112._20_4_ = (uint)!(bool)((byte)(uVar72 >> 5) & 1) * auVar93._20_4_;
      auVar112._24_4_ = (uint)!(bool)((byte)(uVar72 >> 6) & 1) * auVar93._24_4_;
      auVar112._28_4_ = (uint)!SUB81(uVar72 >> 7,0) * auVar93._28_4_;
      bVar74 = (bool)((byte)(uVar72 >> 1) & 1);
      bVar17 = (bool)((byte)(uVar72 >> 2) & 1);
      bVar19 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar113._0_4_ =
           (uint)(bVar69 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar96._0_4_;
      bVar16 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar113._4_4_ = (uint)bVar16 * auVar103._4_4_ | (uint)!bVar16 * auVar96._4_4_;
      bVar16 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar113._8_4_ = (uint)bVar16 * auVar103._8_4_ | (uint)!bVar16 * auVar96._8_4_;
      bVar16 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar113._12_4_ = (uint)bVar16 * auVar103._12_4_ | (uint)!bVar16 * auVar96._12_4_;
      bVar16 = (bool)((byte)(uVar72 >> 4) & 1);
      auVar113._16_4_ = (uint)bVar16 * auVar103._16_4_ | (uint)!bVar16 * auVar96._16_4_;
      bVar16 = (bool)((byte)(uVar72 >> 5) & 1);
      auVar113._20_4_ = (uint)bVar16 * auVar103._20_4_ | (uint)!bVar16 * auVar96._20_4_;
      bVar16 = (bool)((byte)(uVar72 >> 6) & 1);
      auVar113._24_4_ = (uint)bVar16 * auVar103._24_4_ | (uint)!bVar16 * auVar96._24_4_;
      bVar16 = SUB81(uVar72 >> 7,0);
      auVar113._28_4_ = (uint)bVar16 * auVar103._28_4_ | (uint)!bVar16 * auVar96._28_4_;
      auVar96 = vsubps_avx512vl(auVar112,auVar95);
      auVar91 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar80._12_4_ |
                                              (uint)!bVar19 * auVar8._12_4_,
                                              CONCAT48((uint)bVar17 * (int)auVar80._8_4_ |
                                                       (uint)!bVar17 * auVar8._8_4_,
                                                       CONCAT44((uint)bVar74 * (int)auVar80._4_4_ |
                                                                (uint)!bVar74 * auVar8._4_4_,
                                                                (uint)(bVar69 & 1) *
                                                                (int)auVar80._0_4_ |
                                                                (uint)!(bool)(bVar69 & 1) *
                                                                auVar8._0_4_)))),auVar102);
      auVar103 = vsubps_avx512vl(auVar113,auVar108);
      auVar92 = vsubps_avx(auVar95,auVar109);
      auVar93 = vsubps_avx(auVar102,auVar110);
      auVar97 = vsubps_avx512vl(auVar108,auVar111);
      auVar42._4_4_ = auVar103._4_4_ * fVar125;
      auVar42._0_4_ = auVar103._0_4_ * fVar78;
      auVar42._8_4_ = auVar103._8_4_ * fVar129;
      auVar42._12_4_ = auVar103._12_4_ * fVar132;
      auVar42._16_4_ = auVar103._16_4_ * 0.0;
      auVar42._20_4_ = auVar103._20_4_ * 0.0;
      auVar42._24_4_ = auVar103._24_4_ * 0.0;
      auVar42._28_4_ = auVar113._28_4_;
      auVar89 = vfmsub231ps_avx512vl(auVar42,auVar108,auVar96);
      auVar43._4_4_ = fVar126 * auVar96._4_4_;
      auVar43._0_4_ = fVar79 * auVar96._0_4_;
      auVar43._8_4_ = fVar156 * auVar96._8_4_;
      auVar43._12_4_ = fVar133 * auVar96._12_4_;
      auVar43._16_4_ = auVar96._16_4_ * 0.0;
      auVar43._20_4_ = auVar96._20_4_ * 0.0;
      auVar43._24_4_ = auVar96._24_4_ * 0.0;
      auVar43._28_4_ = auVar94._28_4_;
      auVar83 = vfmsub231ps_fma(auVar43,auVar95,auVar91);
      auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar83),auVar86,auVar89);
      auVar89 = vmulps_avx512vl(auVar91,auVar108);
      auVar83 = vfmsub231ps_fma(auVar89,auVar102,auVar103);
      auVar89 = vfmadd231ps_avx512vl(auVar94,auVar86,ZEXT1632(auVar83));
      auVar94 = vmulps_avx512vl(auVar97,auVar109);
      auVar94 = vfmsub231ps_avx512vl(auVar94,auVar92,auVar111);
      auVar44._4_4_ = auVar93._4_4_ * auVar111._4_4_;
      auVar44._0_4_ = auVar93._0_4_ * auVar111._0_4_;
      auVar44._8_4_ = auVar93._8_4_ * auVar111._8_4_;
      auVar44._12_4_ = auVar93._12_4_ * auVar111._12_4_;
      auVar44._16_4_ = auVar93._16_4_ * auVar111._16_4_;
      auVar44._20_4_ = auVar93._20_4_ * auVar111._20_4_;
      auVar44._24_4_ = auVar93._24_4_ * auVar111._24_4_;
      auVar44._28_4_ = auVar111._28_4_;
      auVar83 = vfmsub231ps_fma(auVar44,auVar110,auVar97);
      auVar153._0_4_ = auVar110._0_4_ * auVar92._0_4_;
      auVar153._4_4_ = auVar110._4_4_ * auVar92._4_4_;
      auVar153._8_4_ = auVar110._8_4_ * auVar92._8_4_;
      auVar153._12_4_ = auVar110._12_4_ * auVar92._12_4_;
      auVar153._16_4_ = fVar159 * auVar92._16_4_;
      auVar153._20_4_ = fVar142 * auVar92._20_4_;
      auVar153._24_4_ = fVar139 * auVar92._24_4_;
      auVar153._28_4_ = 0;
      auVar82 = vfmsub231ps_fma(auVar153,auVar93,auVar109);
      auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),auVar86,auVar94);
      auVar90 = vfmadd231ps_avx512vl(auVar94,auVar86,ZEXT1632(auVar83));
      auVar94 = vmaxps_avx(auVar89,auVar90);
      uVar140 = vcmpps_avx512vl(auVar94,auVar86,2);
      bVar77 = bVar77 & (byte)uVar140;
      auVar178 = ZEXT3264(local_360);
      auVar85 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar182 = ZEXT3264(auVar85);
      auVar176 = ZEXT3264(local_3a0);
      auVar181 = ZEXT3264(local_380);
      auVar177 = ZEXT3264(local_440);
      auVar179 = ZEXT3264(local_460);
      auVar183 = ZEXT3264(local_3e0);
      auVar180 = ZEXT3264(local_480);
      if (bVar77 != 0) {
        auVar45._4_4_ = auVar97._4_4_ * auVar91._4_4_;
        auVar45._0_4_ = auVar97._0_4_ * auVar91._0_4_;
        auVar45._8_4_ = auVar97._8_4_ * auVar91._8_4_;
        auVar45._12_4_ = auVar97._12_4_ * auVar91._12_4_;
        auVar45._16_4_ = auVar97._16_4_ * auVar91._16_4_;
        auVar45._20_4_ = auVar97._20_4_ * auVar91._20_4_;
        auVar45._24_4_ = auVar97._24_4_ * auVar91._24_4_;
        auVar45._28_4_ = auVar94._28_4_;
        auVar8 = vfmsub231ps_fma(auVar45,auVar93,auVar103);
        auVar46._4_4_ = auVar103._4_4_ * auVar92._4_4_;
        auVar46._0_4_ = auVar103._0_4_ * auVar92._0_4_;
        auVar46._8_4_ = auVar103._8_4_ * auVar92._8_4_;
        auVar46._12_4_ = auVar103._12_4_ * auVar92._12_4_;
        auVar46._16_4_ = auVar103._16_4_ * auVar92._16_4_;
        auVar46._20_4_ = auVar103._20_4_ * auVar92._20_4_;
        auVar46._24_4_ = auVar103._24_4_ * auVar92._24_4_;
        auVar46._28_4_ = auVar103._28_4_;
        auVar82 = vfmsub231ps_fma(auVar46,auVar96,auVar97);
        auVar47._4_4_ = auVar93._4_4_ * auVar96._4_4_;
        auVar47._0_4_ = auVar93._0_4_ * auVar96._0_4_;
        auVar47._8_4_ = auVar93._8_4_ * auVar96._8_4_;
        auVar47._12_4_ = auVar93._12_4_ * auVar96._12_4_;
        auVar47._16_4_ = auVar93._16_4_ * auVar96._16_4_;
        auVar47._20_4_ = auVar93._20_4_ * auVar96._20_4_;
        auVar47._24_4_ = auVar93._24_4_ * auVar96._24_4_;
        auVar47._28_4_ = auVar93._28_4_;
        auVar9 = vfmsub231ps_fma(auVar47,auVar92,auVar91);
        auVar83 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar82),ZEXT1632(auVar9));
        auVar91 = vfmadd231ps_avx512vl(ZEXT1632(auVar83),ZEXT1632(auVar8),auVar86);
        auVar94 = vrcp14ps_avx512vl(auVar91);
        auVar92 = vfnmadd213ps_avx512vl(auVar94,auVar91,auVar85);
        auVar83 = vfmadd132ps_fma(auVar92,auVar94,auVar94);
        auVar94 = vmulps_avx512vl(auVar108,ZEXT1632(auVar9));
        auVar82 = vfmadd231ps_fma(auVar94,auVar102,ZEXT1632(auVar82));
        auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar95,ZEXT1632(auVar8));
        fVar142 = auVar83._0_4_;
        fVar139 = auVar83._4_4_;
        fVar78 = auVar83._8_4_;
        fVar79 = auVar83._12_4_;
        local_260 = ZEXT1632(CONCAT412(auVar82._12_4_ * fVar79,
                                       CONCAT48(auVar82._8_4_ * fVar78,
                                                CONCAT44(auVar82._4_4_ * fVar139,
                                                         auVar82._0_4_ * fVar142))));
        auVar162._8_4_ = 3;
        auVar162._0_8_ = 0x300000003;
        auVar162._12_4_ = 3;
        auVar162._16_4_ = 3;
        auVar162._20_4_ = 3;
        auVar162._24_4_ = 3;
        auVar162._28_4_ = 3;
        auVar94 = vpermps_avx2(auVar162,ZEXT1632((undefined1  [16])aVar5));
        uVar140 = vcmpps_avx512vl(auVar94,local_260,2);
        fVar159 = local_538->tfar;
        auVar24._4_4_ = fVar159;
        auVar24._0_4_ = fVar159;
        auVar24._8_4_ = fVar159;
        auVar24._12_4_ = fVar159;
        auVar24._16_4_ = fVar159;
        auVar24._20_4_ = fVar159;
        auVar24._24_4_ = fVar159;
        auVar24._28_4_ = fVar159;
        uVar23 = vcmpps_avx512vl(local_260,auVar24,2);
        bVar77 = (byte)uVar140 & (byte)uVar23 & bVar77;
        if (bVar77 != 0) {
          uVar140 = vcmpps_avx512vl(auVar91,auVar86,4);
          bVar77 = bVar77 & (byte)uVar140;
          if (bVar77 != 0) {
            fVar159 = auVar89._0_4_ * fVar142;
            fVar125 = auVar89._4_4_ * fVar139;
            auVar48._4_4_ = fVar125;
            auVar48._0_4_ = fVar159;
            fVar126 = auVar89._8_4_ * fVar78;
            auVar48._8_4_ = fVar126;
            fVar129 = auVar89._12_4_ * fVar79;
            auVar48._12_4_ = fVar129;
            fVar156 = auVar89._16_4_ * 0.0;
            auVar48._16_4_ = fVar156;
            fVar132 = auVar89._20_4_ * 0.0;
            auVar48._20_4_ = fVar132;
            fVar133 = auVar89._24_4_ * 0.0;
            auVar48._24_4_ = fVar133;
            auVar48._28_4_ = auVar91._28_4_;
            auVar94 = vsubps_avx512vl(auVar85,auVar48);
            local_2a0._0_4_ =
                 (float)((uint)(bVar69 & 1) * (int)fVar159 |
                        (uint)!(bool)(bVar69 & 1) * auVar94._0_4_);
            bVar74 = (bool)((byte)(uVar72 >> 1) & 1);
            local_2a0._4_4_ = (float)((uint)bVar74 * (int)fVar125 | (uint)!bVar74 * auVar94._4_4_);
            bVar74 = (bool)((byte)(uVar72 >> 2) & 1);
            local_2a0._8_4_ = (float)((uint)bVar74 * (int)fVar126 | (uint)!bVar74 * auVar94._8_4_);
            bVar74 = (bool)((byte)(uVar72 >> 3) & 1);
            local_2a0._12_4_ = (float)((uint)bVar74 * (int)fVar129 | (uint)!bVar74 * auVar94._12_4_)
            ;
            bVar74 = (bool)((byte)(uVar72 >> 4) & 1);
            local_2a0._16_4_ = (float)((uint)bVar74 * (int)fVar156 | (uint)!bVar74 * auVar94._16_4_)
            ;
            bVar74 = (bool)((byte)(uVar72 >> 5) & 1);
            local_2a0._20_4_ = (float)((uint)bVar74 * (int)fVar132 | (uint)!bVar74 * auVar94._20_4_)
            ;
            bVar74 = (bool)((byte)(uVar72 >> 6) & 1);
            local_2a0._24_4_ = (float)((uint)bVar74 * (int)fVar133 | (uint)!bVar74 * auVar94._24_4_)
            ;
            bVar74 = SUB81(uVar72 >> 7,0);
            local_2a0._28_4_ =
                 (float)((uint)bVar74 * auVar91._28_4_ | (uint)!bVar74 * auVar94._28_4_);
            auVar94 = vsubps_avx(auVar99,auVar98);
            auVar83 = vfmadd213ps_fma(auVar94,local_2a0,auVar98);
            fVar159 = local_520->depth_scale;
            auVar25._4_4_ = fVar159;
            auVar25._0_4_ = fVar159;
            auVar25._8_4_ = fVar159;
            auVar25._12_4_ = fVar159;
            auVar25._16_4_ = fVar159;
            auVar25._20_4_ = fVar159;
            auVar25._24_4_ = fVar159;
            auVar25._28_4_ = fVar159;
            auVar94 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar83._12_4_ + auVar83._12_4_,
                                                         CONCAT48(auVar83._8_4_ + auVar83._8_4_,
                                                                  CONCAT44(auVar83._4_4_ +
                                                                           auVar83._4_4_,
                                                                           auVar83._0_4_ +
                                                                           auVar83._0_4_)))),auVar25
                                     );
            uVar140 = vcmpps_avx512vl(local_260,auVar94,6);
            if (((byte)uVar140 & bVar77) != 0) {
              auVar148._0_4_ = auVar90._0_4_ * fVar142;
              auVar148._4_4_ = auVar90._4_4_ * fVar139;
              auVar148._8_4_ = auVar90._8_4_ * fVar78;
              auVar148._12_4_ = auVar90._12_4_ * fVar79;
              auVar148._16_4_ = auVar90._16_4_ * 0.0;
              auVar148._20_4_ = auVar90._20_4_ * 0.0;
              auVar148._24_4_ = auVar90._24_4_ * 0.0;
              auVar148._28_4_ = 0;
              auVar94 = vsubps_avx512vl(auVar85,auVar148);
              auVar114._0_4_ =
                   (uint)(bVar69 & 1) * (int)auVar148._0_4_ |
                   (uint)!(bool)(bVar69 & 1) * auVar94._0_4_;
              bVar74 = (bool)((byte)(uVar72 >> 1) & 1);
              auVar114._4_4_ = (uint)bVar74 * (int)auVar148._4_4_ | (uint)!bVar74 * auVar94._4_4_;
              bVar74 = (bool)((byte)(uVar72 >> 2) & 1);
              auVar114._8_4_ = (uint)bVar74 * (int)auVar148._8_4_ | (uint)!bVar74 * auVar94._8_4_;
              bVar74 = (bool)((byte)(uVar72 >> 3) & 1);
              auVar114._12_4_ = (uint)bVar74 * (int)auVar148._12_4_ | (uint)!bVar74 * auVar94._12_4_
              ;
              bVar74 = (bool)((byte)(uVar72 >> 4) & 1);
              auVar114._16_4_ = (uint)bVar74 * (int)auVar148._16_4_ | (uint)!bVar74 * auVar94._16_4_
              ;
              bVar74 = (bool)((byte)(uVar72 >> 5) & 1);
              auVar114._20_4_ = (uint)bVar74 * (int)auVar148._20_4_ | (uint)!bVar74 * auVar94._20_4_
              ;
              bVar74 = (bool)((byte)(uVar72 >> 6) & 1);
              auVar114._24_4_ = (uint)bVar74 * (int)auVar148._24_4_ | (uint)!bVar74 * auVar94._24_4_
              ;
              auVar114._28_4_ = (uint)!SUB81(uVar72 >> 7,0) * auVar94._28_4_;
              auVar26._8_4_ = 0x40000000;
              auVar26._0_8_ = 0x4000000040000000;
              auVar26._12_4_ = 0x40000000;
              auVar26._16_4_ = 0x40000000;
              auVar26._20_4_ = 0x40000000;
              auVar26._24_4_ = 0x40000000;
              auVar26._28_4_ = 0x40000000;
              local_280 = vfmsub132ps_avx512vl(auVar114,auVar85,auVar26);
              local_240 = 0;
              local_23c = iVar13;
              local_230 = local_3f0;
              local_220 = local_400;
              local_210 = *(undefined8 *)*pauVar3;
              uStack_208 = *(undefined8 *)(*pauVar3 + 8);
              if ((pGVar14->mask & local_538->mask) != 0) {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (bVar74 = true, pGVar14->occlusionFilterN == (RTCFilterFunctionN)0x0))
                goto LAB_01a86b32;
                fVar159 = 1.0 / (float)local_320._0_4_;
                local_1e0[0] = fVar159 * (local_2a0._0_4_ + 0.0);
                local_1e0[1] = fVar159 * (local_2a0._4_4_ + 1.0);
                local_1e0[2] = fVar159 * (local_2a0._8_4_ + 2.0);
                local_1e0[3] = fVar159 * (local_2a0._12_4_ + 3.0);
                fStack_1d0 = fVar159 * (local_2a0._16_4_ + 4.0);
                fStack_1cc = fVar159 * (local_2a0._20_4_ + 5.0);
                fStack_1c8 = fVar159 * (local_2a0._24_4_ + 6.0);
                fStack_1c4 = local_2a0._28_4_ + 7.0;
                local_1c0 = local_280;
                local_1a0 = local_260;
                lVar71 = 0;
                uVar73 = (ulong)((byte)uVar140 & bVar77);
                for (uVar72 = uVar73; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x8000000000000000)
                {
                  lVar71 = lVar71 + 1;
                }
                local_410 = auVar81;
                while (auVar83 = auVar174._0_16_, auVar81 = local_410, uVar73 != 0) {
                  local_2c0._0_8_ = uVar73;
                  local_4c4 = local_1e0[lVar71];
                  local_4c0 = *(undefined4 *)(local_1c0 + lVar71 * 4);
                  local_528 = CONCAT44(local_528._4_4_,local_538->tfar);
                  local_2e0._0_8_ = lVar71;
                  local_538->tfar = *(float *)(local_1a0 + lVar71 * 4);
                  local_500.context = context->user;
                  fVar142 = 1.0 - local_4c4;
                  fVar159 = fVar142 * fVar142 * -3.0;
                  auVar81 = vfmadd231ss_fma(ZEXT416((uint)(fVar142 * fVar142)),
                                            ZEXT416((uint)(local_4c4 * fVar142)),ZEXT416(0xc0000000)
                                           );
                  auVar82 = vfmsub132ss_fma(ZEXT416((uint)(local_4c4 * fVar142)),
                                            ZEXT416((uint)(local_4c4 * local_4c4)),
                                            ZEXT416(0x40000000));
                  fVar142 = auVar81._0_4_ * 3.0;
                  fVar139 = auVar82._0_4_ * 3.0;
                  fVar78 = local_4c4 * local_4c4 * 3.0;
                  auVar157._0_4_ = fVar78 * local_3c0;
                  auVar157._4_4_ = fVar78 * fStack_3bc;
                  auVar157._8_4_ = fVar78 * fStack_3b8;
                  auVar157._12_4_ = fVar78 * fStack_3b4;
                  auVar144._4_4_ = fVar139;
                  auVar144._0_4_ = fVar139;
                  auVar144._8_4_ = fVar139;
                  auVar144._12_4_ = fVar139;
                  auVar67._8_8_ = uStack_508;
                  auVar67._0_8_ = local_510;
                  auVar81 = vfmadd132ps_fma(auVar144,auVar157,auVar67);
                  auVar149._4_4_ = fVar142;
                  auVar149._0_4_ = fVar142;
                  auVar149._8_4_ = fVar142;
                  auVar149._12_4_ = fVar142;
                  auVar81 = vfmadd213ps_fma(auVar149,local_400,auVar81);
                  auVar145._4_4_ = fVar159;
                  auVar145._0_4_ = fVar159;
                  auVar145._8_4_ = fVar159;
                  auVar145._12_4_ = fVar159;
                  auVar81 = vfmadd213ps_fma(auVar145,local_3f0,auVar81);
                  local_4d0 = vmovlps_avx(auVar81);
                  local_4c8 = vextractps_avx(auVar81,2);
                  local_4bc = (int)local_488;
                  local_4b8 = (int)local_530;
                  local_4b4 = (local_500.context)->instID[0];
                  local_4b0 = (local_500.context)->instPrimID[0];
                  local_54c = -1;
                  local_500.valid = &local_54c;
                  local_500.geometryUserPtr = pGVar14->userPtr;
                  local_500.ray = (RTCRayN *)local_538;
                  local_500.hit = (RTCHitN *)&local_4d0;
                  local_500.N = 1;
                  if ((pGVar14->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                     ((*pGVar14->occlusionFilterN)(&local_500), *local_500.valid != 0)) {
                    p_Var15 = context->args->filter;
                    if ((p_Var15 == (RTCFilterFunctionN)0x0) ||
                       ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT &&
                         (((pGVar14->field_8).field_0x2 & 0x40) == 0)) ||
                        ((*p_Var15)(&local_500), *local_500.valid != 0)))) {
                      bVar74 = true;
                      auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar182 = ZEXT3264(auVar94);
                      auVar81 = vxorps_avx512vl(auVar83,auVar83);
                      auVar174 = ZEXT1664(auVar81);
                      auVar175 = ZEXT3264(local_340);
                      auVar178 = ZEXT3264(local_360);
                      auVar176 = ZEXT3264(local_3a0);
                      auVar181 = ZEXT3264(local_380);
                      auVar177 = ZEXT3264(local_440);
                      auVar179 = ZEXT3264(local_460);
                      auVar183 = ZEXT3264(local_3e0);
                      auVar180 = ZEXT3264(local_480);
                      auVar81 = local_410;
                      goto LAB_01a86b32;
                    }
                  }
                  local_538->tfar = (float)local_528;
                  lVar71 = 0;
                  uVar73 = local_2c0._0_8_ ^ 1L << (local_2e0._0_8_ & 0x3f);
                  for (uVar72 = uVar73; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x8000000000000000
                      ) {
                    lVar71 = lVar71 + 1;
                  }
                  auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                  auVar182 = ZEXT3264(auVar94);
                  auVar81 = vxorps_avx512vl(auVar83,auVar83);
                  auVar174 = ZEXT1664(auVar81);
                  auVar175 = ZEXT3264(local_340);
                  auVar178 = ZEXT3264(local_360);
                  auVar176 = ZEXT3264(local_3a0);
                  auVar181 = ZEXT3264(local_380);
                  auVar177 = ZEXT3264(local_440);
                  auVar179 = ZEXT3264(local_460);
                  auVar183 = ZEXT3264(local_3e0);
                  auVar180 = ZEXT3264(local_480);
                }
              }
            }
          }
        }
      }
      bVar74 = false;
    }
LAB_01a86b32:
    if (8 < iVar13) {
      local_2c0 = vpbroadcastd_avx512vl();
      local_2e0 = vbroadcastss_avx512vl(auVar81);
      auVar138._8_4_ = 3;
      auVar138._0_8_ = 0x300000003;
      auVar138._12_4_ = 3;
      auVar138._16_4_ = 3;
      auVar138._20_4_ = 3;
      auVar138._24_4_ = 3;
      auVar138._28_4_ = 3;
      local_300 = vpermps_avx2(auVar138,local_300);
      local_320._4_4_ = 1.0 / (float)local_320._0_4_;
      local_320._0_4_ = local_320._4_4_;
      fStack_318 = (float)local_320._4_4_;
      fStack_314 = (float)local_320._4_4_;
      fStack_310 = (float)local_320._4_4_;
      fStack_30c = (float)local_320._4_4_;
      fStack_308 = (float)local_320._4_4_;
      fStack_304 = (float)local_320._4_4_;
      local_3e0 = auVar183._0_32_;
      uVar72 = local_530;
      for (lVar71 = 8; lVar71 < local_548; lVar71 = lVar71 + 8) {
        auVar94 = vpbroadcastd_avx512vl();
        auVar96 = vpor_avx2(auVar94,_DAT_01fb4ba0);
        uVar23 = vpcmpd_avx512vl(auVar96,local_2c0,1);
        auVar94 = *(undefined1 (*) [32])(bezier_basis0 + lVar71 * 4 + lVar76);
        auVar91 = *(undefined1 (*) [32])(lVar76 + 0x21fb768 + lVar71 * 4);
        auVar92 = *(undefined1 (*) [32])(lVar76 + 0x21fbbec + lVar71 * 4);
        auVar93 = *(undefined1 (*) [32])(lVar76 + 0x21fc070 + lVar71 * 4);
        auVar171 = auVar183._0_32_;
        auVar95 = vmulps_avx512vl(auVar171,auVar93);
        auVar170 = auVar180._0_32_;
        auVar103 = vmulps_avx512vl(auVar170,auVar93);
        auVar49._4_4_ = auVar93._4_4_ * (float)local_100._4_4_;
        auVar49._0_4_ = auVar93._0_4_ * (float)local_100._0_4_;
        auVar49._8_4_ = auVar93._8_4_ * fStack_f8;
        auVar49._12_4_ = auVar93._12_4_ * fStack_f4;
        auVar49._16_4_ = auVar93._16_4_ * fStack_f0;
        auVar49._20_4_ = auVar93._20_4_ * fStack_ec;
        auVar49._24_4_ = auVar93._24_4_ * fStack_e8;
        auVar49._28_4_ = auVar96._28_4_;
        auVar101 = auVar177._0_32_;
        auVar96 = vfmadd231ps_avx512vl(auVar95,auVar92,auVar101);
        auVar164 = auVar179._0_32_;
        auVar95 = vfmadd231ps_avx512vl(auVar103,auVar92,auVar164);
        auVar103 = vfmadd231ps_avx512vl(auVar49,auVar92,local_e0);
        auVar100 = auVar176._0_32_;
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar91,auVar100);
        local_380 = auVar181._0_32_;
        auVar95 = vfmadd231ps_avx512vl(auVar95,auVar91,local_380);
        auVar81 = vfmadd231ps_fma(auVar103,auVar91,local_c0);
        local_340 = auVar175._0_32_;
        auVar90 = vfmadd231ps_avx512vl(auVar96,auVar94,local_340);
        local_360 = auVar178._0_32_;
        auVar85 = vfmadd231ps_avx512vl(auVar95,auVar94,local_360);
        auVar96 = *(undefined1 (*) [32])(bezier_basis1 + lVar71 * 4 + lVar76);
        auVar95 = *(undefined1 (*) [32])(lVar76 + 0x21fdb88 + lVar71 * 4);
        auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar94,local_a0);
        auVar103 = *(undefined1 (*) [32])(lVar76 + 0x21fe00c + lVar71 * 4);
        auVar102 = *(undefined1 (*) [32])(lVar76 + 0x21fe490 + lVar71 * 4);
        auVar97 = vmulps_avx512vl(auVar171,auVar102);
        auVar89 = vmulps_avx512vl(auVar170,auVar102);
        auVar50._4_4_ = auVar102._4_4_ * (float)local_100._4_4_;
        auVar50._0_4_ = auVar102._0_4_ * (float)local_100._0_4_;
        auVar50._8_4_ = auVar102._8_4_ * fStack_f8;
        auVar50._12_4_ = auVar102._12_4_ * fStack_f4;
        auVar50._16_4_ = auVar102._16_4_ * fStack_f0;
        auVar50._20_4_ = auVar102._20_4_ * fStack_ec;
        auVar50._24_4_ = auVar102._24_4_ * fStack_e8;
        auVar50._28_4_ = uStack_e4;
        auVar97 = vfmadd231ps_avx512vl(auVar97,auVar103,auVar101);
        auVar89 = vfmadd231ps_avx512vl(auVar89,auVar103,auVar164);
        auVar86 = vfmadd231ps_avx512vl(auVar50,auVar103,local_e0);
        auVar97 = vfmadd231ps_avx512vl(auVar97,auVar95,auVar100);
        auVar89 = vfmadd231ps_avx512vl(auVar89,auVar95,local_380);
        auVar83 = vfmadd231ps_fma(auVar86,auVar95,local_c0);
        auVar86 = vfmadd231ps_avx512vl(auVar97,auVar96,local_340);
        auVar87 = vfmadd231ps_avx512vl(auVar89,auVar96,local_360);
        auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar96,local_a0);
        auVar88 = vmaxps_avx512vl(ZEXT1632(auVar81),ZEXT1632(auVar83));
        auVar97 = vsubps_avx(auVar86,auVar90);
        auVar89 = vsubps_avx(auVar87,auVar85);
        auVar98 = vmulps_avx512vl(auVar85,auVar97);
        auVar99 = vmulps_avx512vl(auVar90,auVar89);
        auVar98 = vsubps_avx512vl(auVar98,auVar99);
        auVar99 = vmulps_avx512vl(auVar89,auVar89);
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar97,auVar97);
        auVar88 = vmulps_avx512vl(auVar88,auVar88);
        auVar88 = vmulps_avx512vl(auVar88,auVar99);
        auVar98 = vmulps_avx512vl(auVar98,auVar98);
        uVar140 = vcmpps_avx512vl(auVar98,auVar88,2);
        bVar77 = (byte)uVar23 & (byte)uVar140;
        if (bVar77 == 0) {
          auVar177 = ZEXT3264(auVar101);
        }
        else {
          auVar102 = vmulps_avx512vl(local_180,auVar102);
          auVar103 = vfmadd213ps_avx512vl(auVar103,local_160,auVar102);
          auVar95 = vfmadd213ps_avx512vl(auVar95,local_140,auVar103);
          auVar96 = vfmadd213ps_avx512vl(auVar96,local_120,auVar95);
          auVar93 = vmulps_avx512vl(local_180,auVar93);
          auVar92 = vfmadd213ps_avx512vl(auVar92,local_160,auVar93);
          auVar91 = vfmadd213ps_avx512vl(auVar91,local_140,auVar92);
          auVar95 = vfmadd213ps_avx512vl(auVar94,local_120,auVar91);
          auVar94 = *(undefined1 (*) [32])(lVar76 + 0x21fc4f4 + lVar71 * 4);
          auVar91 = *(undefined1 (*) [32])(lVar76 + 0x21fc978 + lVar71 * 4);
          auVar92 = *(undefined1 (*) [32])(lVar76 + 0x21fcdfc + lVar71 * 4);
          auVar93 = *(undefined1 (*) [32])(lVar76 + 0x21fd280 + lVar71 * 4);
          auVar103 = vmulps_avx512vl(auVar171,auVar93);
          auVar102 = vmulps_avx512vl(auVar170,auVar93);
          auVar93 = vmulps_avx512vl(local_180,auVar93);
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar92,auVar101);
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar92,auVar164);
          auVar92 = vfmadd231ps_avx512vl(auVar93,local_160,auVar92);
          auVar93 = vfmadd231ps_avx512vl(auVar103,auVar91,auVar100);
          auVar103 = vfmadd231ps_avx512vl(auVar102,auVar91,local_380);
          auVar91 = vfmadd231ps_avx512vl(auVar92,local_140,auVar91);
          auVar93 = vfmadd231ps_avx512vl(auVar93,auVar94,local_340);
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar94,local_360);
          auVar102 = vfmadd231ps_avx512vl(auVar91,local_120,auVar94);
          auVar94 = *(undefined1 (*) [32])(lVar76 + 0x21fe914 + lVar71 * 4);
          auVar91 = *(undefined1 (*) [32])(lVar76 + 0x21ff21c + lVar71 * 4);
          auVar92 = *(undefined1 (*) [32])(lVar76 + 0x21ff6a0 + lVar71 * 4);
          auVar88 = vmulps_avx512vl(auVar171,auVar92);
          auVar98 = vmulps_avx512vl(auVar170,auVar92);
          auVar92 = vmulps_avx512vl(local_180,auVar92);
          auVar88 = vfmadd231ps_avx512vl(auVar88,auVar91,auVar101);
          auVar98 = vfmadd231ps_avx512vl(auVar98,auVar91,auVar164);
          auVar92 = vfmadd231ps_avx512vl(auVar92,local_160,auVar91);
          auVar91 = *(undefined1 (*) [32])(lVar76 + 0x21fed98 + lVar71 * 4);
          auVar88 = vfmadd231ps_avx512vl(auVar88,auVar91,auVar100);
          auVar98 = vfmadd231ps_avx512vl(auVar98,auVar91,local_380);
          auVar91 = vfmadd231ps_avx512vl(auVar92,local_140,auVar91);
          auVar92 = vfmadd231ps_avx512vl(auVar88,auVar94,local_340);
          auVar88 = vfmadd231ps_avx512vl(auVar98,auVar94,local_360);
          auVar91 = vfmadd231ps_avx512vl(auVar91,local_120,auVar94);
          auVar98 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar93,auVar98);
          vandps_avx512vl(auVar103,auVar98);
          auVar94 = vmaxps_avx(auVar98,auVar98);
          vandps_avx512vl(auVar102,auVar98);
          auVar94 = vmaxps_avx(auVar94,auVar98);
          uVar73 = vcmpps_avx512vl(auVar94,local_2e0,1);
          bVar16 = (bool)((byte)uVar73 & 1);
          auVar115._0_4_ = (float)((uint)bVar16 * auVar97._0_4_ | (uint)!bVar16 * auVar93._0_4_);
          bVar16 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar115._4_4_ = (float)((uint)bVar16 * auVar97._4_4_ | (uint)!bVar16 * auVar93._4_4_);
          bVar16 = (bool)((byte)(uVar73 >> 2) & 1);
          auVar115._8_4_ = (float)((uint)bVar16 * auVar97._8_4_ | (uint)!bVar16 * auVar93._8_4_);
          bVar16 = (bool)((byte)(uVar73 >> 3) & 1);
          auVar115._12_4_ = (float)((uint)bVar16 * auVar97._12_4_ | (uint)!bVar16 * auVar93._12_4_);
          bVar16 = (bool)((byte)(uVar73 >> 4) & 1);
          auVar115._16_4_ = (float)((uint)bVar16 * auVar97._16_4_ | (uint)!bVar16 * auVar93._16_4_);
          bVar16 = (bool)((byte)(uVar73 >> 5) & 1);
          auVar115._20_4_ = (float)((uint)bVar16 * auVar97._20_4_ | (uint)!bVar16 * auVar93._20_4_);
          bVar16 = (bool)((byte)(uVar73 >> 6) & 1);
          auVar115._24_4_ = (float)((uint)bVar16 * auVar97._24_4_ | (uint)!bVar16 * auVar93._24_4_);
          bVar16 = SUB81(uVar73 >> 7,0);
          auVar115._28_4_ = (uint)bVar16 * auVar97._28_4_ | (uint)!bVar16 * auVar93._28_4_;
          bVar16 = (bool)((byte)uVar73 & 1);
          auVar116._0_4_ = (float)((uint)bVar16 * auVar89._0_4_ | (uint)!bVar16 * auVar103._0_4_);
          bVar16 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar116._4_4_ = (float)((uint)bVar16 * auVar89._4_4_ | (uint)!bVar16 * auVar103._4_4_);
          bVar16 = (bool)((byte)(uVar73 >> 2) & 1);
          auVar116._8_4_ = (float)((uint)bVar16 * auVar89._8_4_ | (uint)!bVar16 * auVar103._8_4_);
          bVar16 = (bool)((byte)(uVar73 >> 3) & 1);
          auVar116._12_4_ = (float)((uint)bVar16 * auVar89._12_4_ | (uint)!bVar16 * auVar103._12_4_)
          ;
          bVar16 = (bool)((byte)(uVar73 >> 4) & 1);
          auVar116._16_4_ = (float)((uint)bVar16 * auVar89._16_4_ | (uint)!bVar16 * auVar103._16_4_)
          ;
          bVar16 = (bool)((byte)(uVar73 >> 5) & 1);
          auVar116._20_4_ = (float)((uint)bVar16 * auVar89._20_4_ | (uint)!bVar16 * auVar103._20_4_)
          ;
          bVar16 = (bool)((byte)(uVar73 >> 6) & 1);
          auVar116._24_4_ = (float)((uint)bVar16 * auVar89._24_4_ | (uint)!bVar16 * auVar103._24_4_)
          ;
          bVar16 = SUB81(uVar73 >> 7,0);
          auVar116._28_4_ = (uint)bVar16 * auVar89._28_4_ | (uint)!bVar16 * auVar103._28_4_;
          vandps_avx512vl(auVar92,auVar98);
          vandps_avx512vl(auVar88,auVar98);
          auVar94 = vmaxps_avx(auVar116,auVar116);
          vandps_avx512vl(auVar91,auVar98);
          auVar94 = vmaxps_avx(auVar94,auVar116);
          uVar73 = vcmpps_avx512vl(auVar94,local_2e0,1);
          bVar16 = (bool)((byte)uVar73 & 1);
          auVar117._0_4_ = (uint)bVar16 * auVar97._0_4_ | (uint)!bVar16 * auVar92._0_4_;
          bVar16 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar117._4_4_ = (uint)bVar16 * auVar97._4_4_ | (uint)!bVar16 * auVar92._4_4_;
          bVar16 = (bool)((byte)(uVar73 >> 2) & 1);
          auVar117._8_4_ = (uint)bVar16 * auVar97._8_4_ | (uint)!bVar16 * auVar92._8_4_;
          bVar16 = (bool)((byte)(uVar73 >> 3) & 1);
          auVar117._12_4_ = (uint)bVar16 * auVar97._12_4_ | (uint)!bVar16 * auVar92._12_4_;
          bVar16 = (bool)((byte)(uVar73 >> 4) & 1);
          auVar117._16_4_ = (uint)bVar16 * auVar97._16_4_ | (uint)!bVar16 * auVar92._16_4_;
          bVar16 = (bool)((byte)(uVar73 >> 5) & 1);
          auVar117._20_4_ = (uint)bVar16 * auVar97._20_4_ | (uint)!bVar16 * auVar92._20_4_;
          bVar16 = (bool)((byte)(uVar73 >> 6) & 1);
          auVar117._24_4_ = (uint)bVar16 * auVar97._24_4_ | (uint)!bVar16 * auVar92._24_4_;
          bVar16 = SUB81(uVar73 >> 7,0);
          auVar117._28_4_ = (uint)bVar16 * auVar97._28_4_ | (uint)!bVar16 * auVar92._28_4_;
          bVar16 = (bool)((byte)uVar73 & 1);
          auVar118._0_4_ = (float)((uint)bVar16 * auVar89._0_4_ | (uint)!bVar16 * auVar88._0_4_);
          bVar16 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar118._4_4_ = (float)((uint)bVar16 * auVar89._4_4_ | (uint)!bVar16 * auVar88._4_4_);
          bVar16 = (bool)((byte)(uVar73 >> 2) & 1);
          auVar118._8_4_ = (float)((uint)bVar16 * auVar89._8_4_ | (uint)!bVar16 * auVar88._8_4_);
          bVar16 = (bool)((byte)(uVar73 >> 3) & 1);
          auVar118._12_4_ = (float)((uint)bVar16 * auVar89._12_4_ | (uint)!bVar16 * auVar88._12_4_);
          bVar16 = (bool)((byte)(uVar73 >> 4) & 1);
          auVar118._16_4_ = (float)((uint)bVar16 * auVar89._16_4_ | (uint)!bVar16 * auVar88._16_4_);
          bVar16 = (bool)((byte)(uVar73 >> 5) & 1);
          auVar118._20_4_ = (float)((uint)bVar16 * auVar89._20_4_ | (uint)!bVar16 * auVar88._20_4_);
          bVar16 = (bool)((byte)(uVar73 >> 6) & 1);
          auVar118._24_4_ = (float)((uint)bVar16 * auVar89._24_4_ | (uint)!bVar16 * auVar88._24_4_);
          bVar16 = SUB81(uVar73 >> 7,0);
          auVar118._28_4_ = (uint)bVar16 * auVar89._28_4_ | (uint)!bVar16 * auVar88._28_4_;
          auVar166._8_4_ = 0x80000000;
          auVar166._0_8_ = 0x8000000080000000;
          auVar166._12_4_ = 0x80000000;
          auVar166._16_4_ = 0x80000000;
          auVar166._20_4_ = 0x80000000;
          auVar166._24_4_ = 0x80000000;
          auVar166._28_4_ = 0x80000000;
          auVar94 = vxorps_avx512vl(auVar117,auVar166);
          auVar88 = auVar174._0_32_;
          auVar91 = vfmadd213ps_avx512vl(auVar115,auVar115,auVar88);
          auVar82 = vfmadd231ps_fma(auVar91,auVar116,auVar116);
          auVar91 = vrsqrt14ps_avx512vl(ZEXT1632(auVar82));
          auVar173._8_4_ = 0xbf000000;
          auVar173._0_8_ = 0xbf000000bf000000;
          auVar173._12_4_ = 0xbf000000;
          auVar173._16_4_ = 0xbf000000;
          auVar173._20_4_ = 0xbf000000;
          auVar173._24_4_ = 0xbf000000;
          auVar173._28_4_ = 0xbf000000;
          fVar159 = auVar91._0_4_;
          fVar142 = auVar91._4_4_;
          fVar139 = auVar91._8_4_;
          fVar78 = auVar91._12_4_;
          fVar79 = auVar91._16_4_;
          fVar125 = auVar91._20_4_;
          fVar126 = auVar91._24_4_;
          auVar51._4_4_ = fVar142 * fVar142 * fVar142 * auVar82._4_4_ * -0.5;
          auVar51._0_4_ = fVar159 * fVar159 * fVar159 * auVar82._0_4_ * -0.5;
          auVar51._8_4_ = fVar139 * fVar139 * fVar139 * auVar82._8_4_ * -0.5;
          auVar51._12_4_ = fVar78 * fVar78 * fVar78 * auVar82._12_4_ * -0.5;
          auVar51._16_4_ = fVar79 * fVar79 * fVar79 * -0.0;
          auVar51._20_4_ = fVar125 * fVar125 * fVar125 * -0.0;
          auVar51._24_4_ = fVar126 * fVar126 * fVar126 * -0.0;
          auVar51._28_4_ = auVar116._28_4_;
          auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar91 = vfmadd231ps_avx512vl(auVar51,auVar92,auVar91);
          auVar52._4_4_ = auVar116._4_4_ * auVar91._4_4_;
          auVar52._0_4_ = auVar116._0_4_ * auVar91._0_4_;
          auVar52._8_4_ = auVar116._8_4_ * auVar91._8_4_;
          auVar52._12_4_ = auVar116._12_4_ * auVar91._12_4_;
          auVar52._16_4_ = auVar116._16_4_ * auVar91._16_4_;
          auVar52._20_4_ = auVar116._20_4_ * auVar91._20_4_;
          auVar52._24_4_ = auVar116._24_4_ * auVar91._24_4_;
          auVar52._28_4_ = 0;
          auVar53._4_4_ = auVar91._4_4_ * -auVar115._4_4_;
          auVar53._0_4_ = auVar91._0_4_ * -auVar115._0_4_;
          auVar53._8_4_ = auVar91._8_4_ * -auVar115._8_4_;
          auVar53._12_4_ = auVar91._12_4_ * -auVar115._12_4_;
          auVar53._16_4_ = auVar91._16_4_ * -auVar115._16_4_;
          auVar53._20_4_ = auVar91._20_4_ * -auVar115._20_4_;
          auVar53._24_4_ = auVar91._24_4_ * -auVar115._24_4_;
          auVar53._28_4_ = auVar116._28_4_;
          auVar93 = vmulps_avx512vl(auVar91,auVar88);
          auVar91 = vfmadd213ps_avx512vl(auVar117,auVar117,auVar88);
          auVar91 = vfmadd231ps_avx512vl(auVar91,auVar118,auVar118);
          auVar103 = vrsqrt14ps_avx512vl(auVar91);
          auVar91 = vmulps_avx512vl(auVar91,auVar173);
          fVar159 = auVar103._0_4_;
          fVar142 = auVar103._4_4_;
          fVar139 = auVar103._8_4_;
          fVar78 = auVar103._12_4_;
          fVar79 = auVar103._16_4_;
          fVar125 = auVar103._20_4_;
          fVar126 = auVar103._24_4_;
          auVar54._4_4_ = fVar142 * fVar142 * fVar142 * auVar91._4_4_;
          auVar54._0_4_ = fVar159 * fVar159 * fVar159 * auVar91._0_4_;
          auVar54._8_4_ = fVar139 * fVar139 * fVar139 * auVar91._8_4_;
          auVar54._12_4_ = fVar78 * fVar78 * fVar78 * auVar91._12_4_;
          auVar54._16_4_ = fVar79 * fVar79 * fVar79 * auVar91._16_4_;
          auVar54._20_4_ = fVar125 * fVar125 * fVar125 * auVar91._20_4_;
          auVar54._24_4_ = fVar126 * fVar126 * fVar126 * auVar91._24_4_;
          auVar54._28_4_ = auVar91._28_4_;
          auVar91 = vfmadd231ps_avx512vl(auVar54,auVar92,auVar103);
          auVar55._4_4_ = auVar118._4_4_ * auVar91._4_4_;
          auVar55._0_4_ = auVar118._0_4_ * auVar91._0_4_;
          auVar55._8_4_ = auVar118._8_4_ * auVar91._8_4_;
          auVar55._12_4_ = auVar118._12_4_ * auVar91._12_4_;
          auVar55._16_4_ = auVar118._16_4_ * auVar91._16_4_;
          auVar55._20_4_ = auVar118._20_4_ * auVar91._20_4_;
          auVar55._24_4_ = auVar118._24_4_ * auVar91._24_4_;
          auVar55._28_4_ = auVar103._28_4_;
          auVar56._4_4_ = auVar91._4_4_ * auVar94._4_4_;
          auVar56._0_4_ = auVar91._0_4_ * auVar94._0_4_;
          auVar56._8_4_ = auVar91._8_4_ * auVar94._8_4_;
          auVar56._12_4_ = auVar91._12_4_ * auVar94._12_4_;
          auVar56._16_4_ = auVar91._16_4_ * auVar94._16_4_;
          auVar56._20_4_ = auVar91._20_4_ * auVar94._20_4_;
          auVar56._24_4_ = auVar91._24_4_ * auVar94._24_4_;
          auVar56._28_4_ = auVar94._28_4_;
          auVar94 = vmulps_avx512vl(auVar91,auVar88);
          auVar82 = vfmadd213ps_fma(auVar52,ZEXT1632(auVar81),auVar90);
          auVar91 = ZEXT1632(auVar81);
          auVar8 = vfmadd213ps_fma(auVar53,auVar91,auVar85);
          auVar92 = vfmadd213ps_avx512vl(auVar93,auVar91,auVar95);
          auVar103 = vfmadd213ps_avx512vl(auVar55,ZEXT1632(auVar83),auVar86);
          auVar12 = vfnmadd213ps_fma(auVar52,auVar91,auVar90);
          auVar102 = ZEXT1632(auVar83);
          auVar9 = vfmadd213ps_fma(auVar56,auVar102,auVar87);
          auVar22 = vfnmadd213ps_fma(auVar53,auVar91,auVar85);
          auVar10 = vfmadd213ps_fma(auVar94,auVar102,auVar96);
          auVar85 = ZEXT1632(auVar81);
          auVar160 = vfnmadd231ps_fma(auVar95,auVar85,auVar93);
          auVar84 = vfnmadd213ps_fma(auVar55,auVar102,auVar86);
          auVar143 = vfnmadd213ps_fma(auVar56,auVar102,auVar87);
          auVar161 = vfnmadd231ps_fma(auVar96,ZEXT1632(auVar83),auVar94);
          auVar96 = vsubps_avx512vl(auVar103,ZEXT1632(auVar12));
          auVar94 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar22));
          auVar91 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar160));
          auVar57._4_4_ = auVar94._4_4_ * auVar160._4_4_;
          auVar57._0_4_ = auVar94._0_4_ * auVar160._0_4_;
          auVar57._8_4_ = auVar94._8_4_ * auVar160._8_4_;
          auVar57._12_4_ = auVar94._12_4_ * auVar160._12_4_;
          auVar57._16_4_ = auVar94._16_4_ * 0.0;
          auVar57._20_4_ = auVar94._20_4_ * 0.0;
          auVar57._24_4_ = auVar94._24_4_ * 0.0;
          auVar57._28_4_ = auVar93._28_4_;
          auVar81 = vfmsub231ps_fma(auVar57,ZEXT1632(auVar22),auVar91);
          auVar58._4_4_ = auVar91._4_4_ * auVar12._4_4_;
          auVar58._0_4_ = auVar91._0_4_ * auVar12._0_4_;
          auVar58._8_4_ = auVar91._8_4_ * auVar12._8_4_;
          auVar58._12_4_ = auVar91._12_4_ * auVar12._12_4_;
          auVar58._16_4_ = auVar91._16_4_ * 0.0;
          auVar58._20_4_ = auVar91._20_4_ * 0.0;
          auVar58._24_4_ = auVar91._24_4_ * 0.0;
          auVar58._28_4_ = auVar91._28_4_;
          auVar11 = vfmsub231ps_fma(auVar58,ZEXT1632(auVar160),auVar96);
          auVar59._4_4_ = auVar22._4_4_ * auVar96._4_4_;
          auVar59._0_4_ = auVar22._0_4_ * auVar96._0_4_;
          auVar59._8_4_ = auVar22._8_4_ * auVar96._8_4_;
          auVar59._12_4_ = auVar22._12_4_ * auVar96._12_4_;
          auVar59._16_4_ = auVar96._16_4_ * 0.0;
          auVar59._20_4_ = auVar96._20_4_ * 0.0;
          auVar59._24_4_ = auVar96._24_4_ * 0.0;
          auVar59._28_4_ = auVar96._28_4_;
          auVar80 = vfmsub231ps_fma(auVar59,ZEXT1632(auVar12),auVar94);
          auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar80),auVar88,ZEXT1632(auVar11));
          auVar94 = vfmadd231ps_avx512vl(auVar94,auVar88,ZEXT1632(auVar81));
          uVar73 = vcmpps_avx512vl(auVar94,auVar88,2);
          bVar69 = (byte)uVar73;
          fVar132 = (float)((uint)(bVar69 & 1) * auVar82._0_4_ |
                           (uint)!(bool)(bVar69 & 1) * auVar84._0_4_);
          bVar16 = (bool)((byte)(uVar73 >> 1) & 1);
          fVar127 = (float)((uint)bVar16 * auVar82._4_4_ | (uint)!bVar16 * auVar84._4_4_);
          bVar16 = (bool)((byte)(uVar73 >> 2) & 1);
          fVar130 = (float)((uint)bVar16 * auVar82._8_4_ | (uint)!bVar16 * auVar84._8_4_);
          bVar16 = (bool)((byte)(uVar73 >> 3) & 1);
          fVar134 = (float)((uint)bVar16 * auVar82._12_4_ | (uint)!bVar16 * auVar84._12_4_);
          auVar102 = ZEXT1632(CONCAT412(fVar134,CONCAT48(fVar130,CONCAT44(fVar127,fVar132))));
          fVar133 = (float)((uint)(bVar69 & 1) * auVar8._0_4_ |
                           (uint)!(bool)(bVar69 & 1) * auVar143._0_4_);
          bVar16 = (bool)((byte)(uVar73 >> 1) & 1);
          fVar128 = (float)((uint)bVar16 * auVar8._4_4_ | (uint)!bVar16 * auVar143._4_4_);
          bVar16 = (bool)((byte)(uVar73 >> 2) & 1);
          fVar131 = (float)((uint)bVar16 * auVar8._8_4_ | (uint)!bVar16 * auVar143._8_4_);
          bVar16 = (bool)((byte)(uVar73 >> 3) & 1);
          fVar135 = (float)((uint)bVar16 * auVar8._12_4_ | (uint)!bVar16 * auVar143._12_4_);
          auVar97 = ZEXT1632(CONCAT412(fVar135,CONCAT48(fVar131,CONCAT44(fVar128,fVar133))));
          auVar119._0_4_ =
               (float)((uint)(bVar69 & 1) * auVar92._0_4_ |
                      (uint)!(bool)(bVar69 & 1) * auVar161._0_4_);
          bVar16 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar119._4_4_ = (float)((uint)bVar16 * auVar92._4_4_ | (uint)!bVar16 * auVar161._4_4_);
          bVar16 = (bool)((byte)(uVar73 >> 2) & 1);
          auVar119._8_4_ = (float)((uint)bVar16 * auVar92._8_4_ | (uint)!bVar16 * auVar161._8_4_);
          bVar16 = (bool)((byte)(uVar73 >> 3) & 1);
          auVar119._12_4_ = (float)((uint)bVar16 * auVar92._12_4_ | (uint)!bVar16 * auVar161._12_4_)
          ;
          fVar139 = (float)((uint)((byte)(uVar73 >> 4) & 1) * auVar92._16_4_);
          auVar119._16_4_ = fVar139;
          fVar142 = (float)((uint)((byte)(uVar73 >> 5) & 1) * auVar92._20_4_);
          auVar119._20_4_ = fVar142;
          fVar159 = (float)((uint)((byte)(uVar73 >> 6) & 1) * auVar92._24_4_);
          auVar119._24_4_ = fVar159;
          iVar1 = (uint)(byte)(uVar73 >> 7) * auVar92._28_4_;
          auVar119._28_4_ = iVar1;
          auVar94 = vblendmps_avx512vl(ZEXT1632(auVar12),auVar103);
          auVar120._0_4_ =
               (uint)(bVar69 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar81._0_4_;
          bVar16 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar120._4_4_ = (uint)bVar16 * auVar94._4_4_ | (uint)!bVar16 * auVar81._4_4_;
          bVar16 = (bool)((byte)(uVar73 >> 2) & 1);
          auVar120._8_4_ = (uint)bVar16 * auVar94._8_4_ | (uint)!bVar16 * auVar81._8_4_;
          bVar16 = (bool)((byte)(uVar73 >> 3) & 1);
          auVar120._12_4_ = (uint)bVar16 * auVar94._12_4_ | (uint)!bVar16 * auVar81._12_4_;
          auVar120._16_4_ = (uint)((byte)(uVar73 >> 4) & 1) * auVar94._16_4_;
          auVar120._20_4_ = (uint)((byte)(uVar73 >> 5) & 1) * auVar94._20_4_;
          auVar120._24_4_ = (uint)((byte)(uVar73 >> 6) & 1) * auVar94._24_4_;
          auVar120._28_4_ = (uint)(byte)(uVar73 >> 7) * auVar94._28_4_;
          auVar94 = vblendmps_avx512vl(ZEXT1632(auVar22),ZEXT1632(auVar9));
          auVar121._0_4_ =
               (float)((uint)(bVar69 & 1) * auVar94._0_4_ |
                      (uint)!(bool)(bVar69 & 1) * auVar82._0_4_);
          bVar16 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar121._4_4_ = (float)((uint)bVar16 * auVar94._4_4_ | (uint)!bVar16 * auVar82._4_4_);
          bVar16 = (bool)((byte)(uVar73 >> 2) & 1);
          auVar121._8_4_ = (float)((uint)bVar16 * auVar94._8_4_ | (uint)!bVar16 * auVar82._8_4_);
          bVar16 = (bool)((byte)(uVar73 >> 3) & 1);
          auVar121._12_4_ = (float)((uint)bVar16 * auVar94._12_4_ | (uint)!bVar16 * auVar82._12_4_);
          fVar79 = (float)((uint)((byte)(uVar73 >> 4) & 1) * auVar94._16_4_);
          auVar121._16_4_ = fVar79;
          fVar78 = (float)((uint)((byte)(uVar73 >> 5) & 1) * auVar94._20_4_);
          auVar121._20_4_ = fVar78;
          fVar125 = (float)((uint)((byte)(uVar73 >> 6) & 1) * auVar94._24_4_);
          auVar121._24_4_ = fVar125;
          auVar121._28_4_ = (uint)(byte)(uVar73 >> 7) * auVar94._28_4_;
          auVar94 = vblendmps_avx512vl(ZEXT1632(auVar160),ZEXT1632(auVar10));
          auVar122._0_4_ =
               (float)((uint)(bVar69 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar8._0_4_
                      );
          bVar16 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar122._4_4_ = (float)((uint)bVar16 * auVar94._4_4_ | (uint)!bVar16 * auVar8._4_4_);
          bVar16 = (bool)((byte)(uVar73 >> 2) & 1);
          auVar122._8_4_ = (float)((uint)bVar16 * auVar94._8_4_ | (uint)!bVar16 * auVar8._8_4_);
          bVar16 = (bool)((byte)(uVar73 >> 3) & 1);
          auVar122._12_4_ = (float)((uint)bVar16 * auVar94._12_4_ | (uint)!bVar16 * auVar8._12_4_);
          fVar156 = (float)((uint)((byte)(uVar73 >> 4) & 1) * auVar94._16_4_);
          auVar122._16_4_ = fVar156;
          fVar126 = (float)((uint)((byte)(uVar73 >> 5) & 1) * auVar94._20_4_);
          auVar122._20_4_ = fVar126;
          fVar129 = (float)((uint)((byte)(uVar73 >> 6) & 1) * auVar94._24_4_);
          auVar122._24_4_ = fVar129;
          iVar2 = (uint)(byte)(uVar73 >> 7) * auVar94._28_4_;
          auVar122._28_4_ = iVar2;
          auVar123._0_4_ =
               (uint)(bVar69 & 1) * (int)auVar12._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar103._0_4_;
          bVar16 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar123._4_4_ = (uint)bVar16 * (int)auVar12._4_4_ | (uint)!bVar16 * auVar103._4_4_;
          bVar16 = (bool)((byte)(uVar73 >> 2) & 1);
          auVar123._8_4_ = (uint)bVar16 * (int)auVar12._8_4_ | (uint)!bVar16 * auVar103._8_4_;
          bVar16 = (bool)((byte)(uVar73 >> 3) & 1);
          auVar123._12_4_ = (uint)bVar16 * (int)auVar12._12_4_ | (uint)!bVar16 * auVar103._12_4_;
          auVar123._16_4_ = (uint)!(bool)((byte)(uVar73 >> 4) & 1) * auVar103._16_4_;
          auVar123._20_4_ = (uint)!(bool)((byte)(uVar73 >> 5) & 1) * auVar103._20_4_;
          auVar123._24_4_ = (uint)!(bool)((byte)(uVar73 >> 6) & 1) * auVar103._24_4_;
          auVar123._28_4_ = (uint)!SUB81(uVar73 >> 7,0) * auVar103._28_4_;
          bVar16 = (bool)((byte)(uVar73 >> 1) & 1);
          bVar19 = (bool)((byte)(uVar73 >> 2) & 1);
          bVar20 = (bool)((byte)(uVar73 >> 3) & 1);
          bVar17 = (bool)((byte)(uVar73 >> 1) & 1);
          bVar18 = (bool)((byte)(uVar73 >> 2) & 1);
          bVar21 = (bool)((byte)(uVar73 >> 3) & 1);
          auVar103 = vsubps_avx512vl(auVar123,auVar102);
          auVar91 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar20 * (int)auVar22._12_4_ |
                                                  (uint)!bVar20 * auVar9._12_4_,
                                                  CONCAT48((uint)bVar19 * (int)auVar22._8_4_ |
                                                           (uint)!bVar19 * auVar9._8_4_,
                                                           CONCAT44((uint)bVar16 *
                                                                    (int)auVar22._4_4_ |
                                                                    (uint)!bVar16 * auVar9._4_4_,
                                                                    (uint)(bVar69 & 1) *
                                                                    (int)auVar22._0_4_ |
                                                                    (uint)!(bool)(bVar69 & 1) *
                                                                    auVar9._0_4_)))),auVar97);
          auVar92 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar21 * (int)auVar160._12_4_ |
                                                  (uint)!bVar21 * auVar10._12_4_,
                                                  CONCAT48((uint)bVar18 * (int)auVar160._8_4_ |
                                                           (uint)!bVar18 * auVar10._8_4_,
                                                           CONCAT44((uint)bVar17 *
                                                                    (int)auVar160._4_4_ |
                                                                    (uint)!bVar17 * auVar10._4_4_,
                                                                    (uint)(bVar69 & 1) *
                                                                    (int)auVar160._0_4_ |
                                                                    (uint)!(bool)(bVar69 & 1) *
                                                                    auVar10._0_4_)))),auVar119);
          auVar93 = vsubps_avx(auVar102,auVar120);
          auVar96 = vsubps_avx(auVar97,auVar121);
          auVar95 = vsubps_avx(auVar119,auVar122);
          auVar60._4_4_ = auVar92._4_4_ * fVar127;
          auVar60._0_4_ = auVar92._0_4_ * fVar132;
          auVar60._8_4_ = auVar92._8_4_ * fVar130;
          auVar60._12_4_ = auVar92._12_4_ * fVar134;
          auVar60._16_4_ = auVar92._16_4_ * 0.0;
          auVar60._20_4_ = auVar92._20_4_ * 0.0;
          auVar60._24_4_ = auVar92._24_4_ * 0.0;
          auVar60._28_4_ = 0;
          auVar81 = vfmsub231ps_fma(auVar60,auVar119,auVar103);
          auVar152._0_4_ = fVar133 * auVar103._0_4_;
          auVar152._4_4_ = fVar128 * auVar103._4_4_;
          auVar152._8_4_ = fVar131 * auVar103._8_4_;
          auVar152._12_4_ = fVar135 * auVar103._12_4_;
          auVar152._16_4_ = auVar103._16_4_ * 0.0;
          auVar152._20_4_ = auVar103._20_4_ * 0.0;
          auVar152._24_4_ = auVar103._24_4_ * 0.0;
          auVar152._28_4_ = 0;
          auVar82 = vfmsub231ps_fma(auVar152,auVar102,auVar91);
          auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),auVar88,ZEXT1632(auVar81));
          auVar154._0_4_ = auVar91._0_4_ * auVar119._0_4_;
          auVar154._4_4_ = auVar91._4_4_ * auVar119._4_4_;
          auVar154._8_4_ = auVar91._8_4_ * auVar119._8_4_;
          auVar154._12_4_ = auVar91._12_4_ * auVar119._12_4_;
          auVar154._16_4_ = auVar91._16_4_ * fVar139;
          auVar154._20_4_ = auVar91._20_4_ * fVar142;
          auVar154._24_4_ = auVar91._24_4_ * fVar159;
          auVar154._28_4_ = 0;
          auVar81 = vfmsub231ps_fma(auVar154,auVar97,auVar92);
          auVar89 = vfmadd231ps_avx512vl(auVar94,auVar88,ZEXT1632(auVar81));
          auVar94 = vmulps_avx512vl(auVar95,auVar120);
          auVar94 = vfmsub231ps_avx512vl(auVar94,auVar93,auVar122);
          auVar61._4_4_ = auVar96._4_4_ * auVar122._4_4_;
          auVar61._0_4_ = auVar96._0_4_ * auVar122._0_4_;
          auVar61._8_4_ = auVar96._8_4_ * auVar122._8_4_;
          auVar61._12_4_ = auVar96._12_4_ * auVar122._12_4_;
          auVar61._16_4_ = auVar96._16_4_ * fVar156;
          auVar61._20_4_ = auVar96._20_4_ * fVar126;
          auVar61._24_4_ = auVar96._24_4_ * fVar129;
          auVar61._28_4_ = iVar2;
          auVar81 = vfmsub231ps_fma(auVar61,auVar121,auVar95);
          auVar155._0_4_ = auVar121._0_4_ * auVar93._0_4_;
          auVar155._4_4_ = auVar121._4_4_ * auVar93._4_4_;
          auVar155._8_4_ = auVar121._8_4_ * auVar93._8_4_;
          auVar155._12_4_ = auVar121._12_4_ * auVar93._12_4_;
          auVar155._16_4_ = fVar79 * auVar93._16_4_;
          auVar155._20_4_ = fVar78 * auVar93._20_4_;
          auVar155._24_4_ = fVar125 * auVar93._24_4_;
          auVar155._28_4_ = 0;
          auVar82 = vfmsub231ps_fma(auVar155,auVar96,auVar120);
          auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),auVar88,auVar94);
          auVar90 = vfmadd231ps_avx512vl(auVar94,auVar88,ZEXT1632(auVar81));
          auVar94 = vmaxps_avx(auVar89,auVar90);
          uVar140 = vcmpps_avx512vl(auVar94,auVar88,2);
          bVar77 = bVar77 & (byte)uVar140;
          if (bVar77 != 0) {
            auVar62._4_4_ = auVar95._4_4_ * auVar91._4_4_;
            auVar62._0_4_ = auVar95._0_4_ * auVar91._0_4_;
            auVar62._8_4_ = auVar95._8_4_ * auVar91._8_4_;
            auVar62._12_4_ = auVar95._12_4_ * auVar91._12_4_;
            auVar62._16_4_ = auVar95._16_4_ * auVar91._16_4_;
            auVar62._20_4_ = auVar95._20_4_ * auVar91._20_4_;
            auVar62._24_4_ = auVar95._24_4_ * auVar91._24_4_;
            auVar62._28_4_ = auVar94._28_4_;
            auVar8 = vfmsub231ps_fma(auVar62,auVar96,auVar92);
            auVar63._4_4_ = auVar92._4_4_ * auVar93._4_4_;
            auVar63._0_4_ = auVar92._0_4_ * auVar93._0_4_;
            auVar63._8_4_ = auVar92._8_4_ * auVar93._8_4_;
            auVar63._12_4_ = auVar92._12_4_ * auVar93._12_4_;
            auVar63._16_4_ = auVar92._16_4_ * auVar93._16_4_;
            auVar63._20_4_ = auVar92._20_4_ * auVar93._20_4_;
            auVar63._24_4_ = auVar92._24_4_ * auVar93._24_4_;
            auVar63._28_4_ = auVar92._28_4_;
            auVar82 = vfmsub231ps_fma(auVar63,auVar103,auVar95);
            auVar64._4_4_ = auVar96._4_4_ * auVar103._4_4_;
            auVar64._0_4_ = auVar96._0_4_ * auVar103._0_4_;
            auVar64._8_4_ = auVar96._8_4_ * auVar103._8_4_;
            auVar64._12_4_ = auVar96._12_4_ * auVar103._12_4_;
            auVar64._16_4_ = auVar96._16_4_ * auVar103._16_4_;
            auVar64._20_4_ = auVar96._20_4_ * auVar103._20_4_;
            auVar64._24_4_ = auVar96._24_4_ * auVar103._24_4_;
            auVar64._28_4_ = auVar96._28_4_;
            auVar9 = vfmsub231ps_fma(auVar64,auVar93,auVar91);
            auVar81 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar82),ZEXT1632(auVar9));
            auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),ZEXT1632(auVar8),auVar88);
            auVar91 = vrcp14ps_avx512vl(auVar94);
            auVar93 = auVar182._0_32_;
            auVar92 = vfnmadd213ps_avx512vl(auVar91,auVar94,auVar93);
            auVar81 = vfmadd132ps_fma(auVar92,auVar91,auVar91);
            auVar65._4_4_ = auVar9._4_4_ * auVar119._4_4_;
            auVar65._0_4_ = auVar9._0_4_ * auVar119._0_4_;
            auVar65._8_4_ = auVar9._8_4_ * auVar119._8_4_;
            auVar65._12_4_ = auVar9._12_4_ * auVar119._12_4_;
            auVar65._16_4_ = fVar139 * 0.0;
            auVar65._20_4_ = fVar142 * 0.0;
            auVar65._24_4_ = fVar159 * 0.0;
            auVar65._28_4_ = iVar1;
            auVar82 = vfmadd231ps_fma(auVar65,auVar97,ZEXT1632(auVar82));
            auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar102,ZEXT1632(auVar8));
            fVar142 = auVar81._0_4_;
            fVar139 = auVar81._4_4_;
            fVar78 = auVar81._8_4_;
            fVar79 = auVar81._12_4_;
            local_260 = ZEXT1632(CONCAT412(auVar82._12_4_ * fVar79,
                                           CONCAT48(auVar82._8_4_ * fVar78,
                                                    CONCAT44(auVar82._4_4_ * fVar139,
                                                             auVar82._0_4_ * fVar142))));
            uVar140 = vcmpps_avx512vl(local_260,local_300,0xd);
            fVar159 = local_538->tfar;
            auVar28._4_4_ = fVar159;
            auVar28._0_4_ = fVar159;
            auVar28._8_4_ = fVar159;
            auVar28._12_4_ = fVar159;
            auVar28._16_4_ = fVar159;
            auVar28._20_4_ = fVar159;
            auVar28._24_4_ = fVar159;
            auVar28._28_4_ = fVar159;
            uVar23 = vcmpps_avx512vl(local_260,auVar28,2);
            bVar77 = (byte)uVar140 & (byte)uVar23 & bVar77;
            if (bVar77 != 0) {
              uVar140 = vcmpps_avx512vl(auVar94,auVar88,4);
              bVar77 = bVar77 & (byte)uVar140;
              auVar177 = ZEXT3264(local_440);
              auVar179 = ZEXT3264(local_460);
              auVar183 = ZEXT3264(local_3e0);
              auVar180 = ZEXT3264(local_480);
              if (bVar77 != 0) {
                fVar159 = auVar89._0_4_ * fVar142;
                fVar125 = auVar89._4_4_ * fVar139;
                auVar66._4_4_ = fVar125;
                auVar66._0_4_ = fVar159;
                fVar126 = auVar89._8_4_ * fVar78;
                auVar66._8_4_ = fVar126;
                fVar129 = auVar89._12_4_ * fVar79;
                auVar66._12_4_ = fVar129;
                fVar156 = auVar89._16_4_ * 0.0;
                auVar66._16_4_ = fVar156;
                fVar132 = auVar89._20_4_ * 0.0;
                auVar66._20_4_ = fVar132;
                fVar133 = auVar89._24_4_ * 0.0;
                auVar66._24_4_ = fVar133;
                auVar66._28_4_ = auVar94._28_4_;
                auVar91 = vsubps_avx512vl(auVar93,auVar66);
                local_2a0._0_4_ =
                     (float)((uint)(bVar69 & 1) * (int)fVar159 |
                            (uint)!(bool)(bVar69 & 1) * auVar91._0_4_);
                bVar16 = (bool)((byte)(uVar73 >> 1) & 1);
                local_2a0._4_4_ =
                     (float)((uint)bVar16 * (int)fVar125 | (uint)!bVar16 * auVar91._4_4_);
                bVar16 = (bool)((byte)(uVar73 >> 2) & 1);
                local_2a0._8_4_ =
                     (float)((uint)bVar16 * (int)fVar126 | (uint)!bVar16 * auVar91._8_4_);
                bVar16 = (bool)((byte)(uVar73 >> 3) & 1);
                local_2a0._12_4_ =
                     (float)((uint)bVar16 * (int)fVar129 | (uint)!bVar16 * auVar91._12_4_);
                bVar16 = (bool)((byte)(uVar73 >> 4) & 1);
                local_2a0._16_4_ =
                     (float)((uint)bVar16 * (int)fVar156 | (uint)!bVar16 * auVar91._16_4_);
                bVar16 = (bool)((byte)(uVar73 >> 5) & 1);
                local_2a0._20_4_ =
                     (float)((uint)bVar16 * (int)fVar132 | (uint)!bVar16 * auVar91._20_4_);
                bVar16 = (bool)((byte)(uVar73 >> 6) & 1);
                local_2a0._24_4_ =
                     (float)((uint)bVar16 * (int)fVar133 | (uint)!bVar16 * auVar91._24_4_);
                bVar16 = SUB81(uVar73 >> 7,0);
                local_2a0._28_4_ =
                     (float)((uint)bVar16 * auVar94._28_4_ | (uint)!bVar16 * auVar91._28_4_);
                auVar94 = vsubps_avx(ZEXT1632(auVar83),auVar85);
                auVar81 = vfmadd213ps_fma(auVar94,local_2a0,auVar85);
                fVar159 = local_520->depth_scale;
                auVar29._4_4_ = fVar159;
                auVar29._0_4_ = fVar159;
                auVar29._8_4_ = fVar159;
                auVar29._12_4_ = fVar159;
                auVar29._16_4_ = fVar159;
                auVar29._20_4_ = fVar159;
                auVar29._24_4_ = fVar159;
                auVar29._28_4_ = fVar159;
                auVar94 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar81._12_4_ + auVar81._12_4_,
                                                             CONCAT48(auVar81._8_4_ + auVar81._8_4_,
                                                                      CONCAT44(auVar81._4_4_ +
                                                                               auVar81._4_4_,
                                                                               auVar81._0_4_ +
                                                                               auVar81._0_4_)))),
                                          auVar29);
                uVar140 = vcmpps_avx512vl(local_260,auVar94,6);
                if (((byte)uVar140 & bVar77) != 0) {
                  auVar141._0_4_ = auVar90._0_4_ * fVar142;
                  auVar141._4_4_ = auVar90._4_4_ * fVar139;
                  auVar141._8_4_ = auVar90._8_4_ * fVar78;
                  auVar141._12_4_ = auVar90._12_4_ * fVar79;
                  auVar141._16_4_ = auVar90._16_4_ * 0.0;
                  auVar141._20_4_ = auVar90._20_4_ * 0.0;
                  auVar141._24_4_ = auVar90._24_4_ * 0.0;
                  auVar141._28_4_ = 0;
                  auVar94 = vsubps_avx512vl(auVar93,auVar141);
                  auVar124._0_4_ =
                       (uint)(bVar69 & 1) * (int)auVar141._0_4_ |
                       (uint)!(bool)(bVar69 & 1) * auVar94._0_4_;
                  bVar16 = (bool)((byte)(uVar73 >> 1) & 1);
                  auVar124._4_4_ =
                       (uint)bVar16 * (int)auVar141._4_4_ | (uint)!bVar16 * auVar94._4_4_;
                  bVar16 = (bool)((byte)(uVar73 >> 2) & 1);
                  auVar124._8_4_ =
                       (uint)bVar16 * (int)auVar141._8_4_ | (uint)!bVar16 * auVar94._8_4_;
                  bVar16 = (bool)((byte)(uVar73 >> 3) & 1);
                  auVar124._12_4_ =
                       (uint)bVar16 * (int)auVar141._12_4_ | (uint)!bVar16 * auVar94._12_4_;
                  bVar16 = (bool)((byte)(uVar73 >> 4) & 1);
                  auVar124._16_4_ =
                       (uint)bVar16 * (int)auVar141._16_4_ | (uint)!bVar16 * auVar94._16_4_;
                  bVar16 = (bool)((byte)(uVar73 >> 5) & 1);
                  auVar124._20_4_ =
                       (uint)bVar16 * (int)auVar141._20_4_ | (uint)!bVar16 * auVar94._20_4_;
                  bVar16 = (bool)((byte)(uVar73 >> 6) & 1);
                  auVar124._24_4_ =
                       (uint)bVar16 * (int)auVar141._24_4_ | (uint)!bVar16 * auVar94._24_4_;
                  auVar124._28_4_ = (uint)!SUB81(uVar73 >> 7,0) * auVar94._28_4_;
                  auVar30._8_4_ = 0x40000000;
                  auVar30._0_8_ = 0x4000000040000000;
                  auVar30._12_4_ = 0x40000000;
                  auVar30._16_4_ = 0x40000000;
                  auVar30._20_4_ = 0x40000000;
                  auVar30._24_4_ = 0x40000000;
                  auVar30._28_4_ = 0x40000000;
                  local_280 = vfmsub132ps_avx512vl(auVar124,auVar93,auVar30);
                  local_240 = (int)lVar71;
                  local_23c = iVar13;
                  local_230 = local_3f0;
                  local_220 = local_400;
                  local_210 = local_510;
                  uStack_208 = uStack_508;
                  pGVar14 = (context->scene->geometries).items[uVar72].ptr;
                  if ((pGVar14->mask & local_538->mask) == 0) {
                    bVar69 = 0;
                  }
                  else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                          (bVar69 = 1, pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    local_490 = pGVar14;
                    auVar81 = vcvtsi2ss_avx512f(auVar98._0_16_,(int)lVar71);
                    fVar159 = auVar81._0_4_;
                    local_1e0[0] = (fVar159 + local_2a0._0_4_ + 0.0) * (float)local_320._0_4_;
                    local_1e0[1] = (fVar159 + local_2a0._4_4_ + 1.0) * (float)local_320._4_4_;
                    local_1e0[2] = (fVar159 + local_2a0._8_4_ + 2.0) * fStack_318;
                    local_1e0[3] = (fVar159 + local_2a0._12_4_ + 3.0) * fStack_314;
                    fStack_1d0 = (fVar159 + local_2a0._16_4_ + 4.0) * fStack_310;
                    fStack_1cc = (fVar159 + local_2a0._20_4_ + 5.0) * fStack_30c;
                    fStack_1c8 = (fVar159 + local_2a0._24_4_ + 6.0) * fStack_308;
                    fStack_1c4 = fVar159 + local_2a0._28_4_ + 7.0;
                    local_1c0 = local_280;
                    local_1a0 = local_260;
                    lVar70 = 0;
                    local_528 = (ulong)((byte)uVar140 & bVar77);
                    for (uVar72 = local_528; (uVar72 & 1) == 0;
                        uVar72 = uVar72 >> 1 | 0x8000000000000000) {
                      lVar70 = lVar70 + 1;
                    }
                    local_498 = context;
                    while (local_528 != 0) {
                      local_4c4 = local_1e0[lVar70];
                      local_4c0 = *(undefined4 *)(local_1c0 + lVar70 * 4);
                      local_514 = local_538->tfar;
                      local_410._0_8_ = lVar70;
                      local_538->tfar = *(float *)(local_1a0 + lVar70 * 4);
                      local_500.context = local_498->user;
                      fVar142 = 1.0 - local_4c4;
                      fVar159 = fVar142 * fVar142 * -3.0;
                      auVar81 = vfmadd231ss_fma(ZEXT416((uint)(fVar142 * fVar142)),
                                                ZEXT416((uint)(local_4c4 * fVar142)),
                                                ZEXT416(0xc0000000));
                      auVar83 = vfmsub132ss_fma(ZEXT416((uint)(local_4c4 * fVar142)),
                                                ZEXT416((uint)(local_4c4 * local_4c4)),
                                                ZEXT416(0x40000000));
                      fVar142 = auVar81._0_4_ * 3.0;
                      fVar139 = auVar83._0_4_ * 3.0;
                      fVar78 = local_4c4 * local_4c4 * 3.0;
                      auVar158._0_4_ = fVar78 * local_3c0;
                      auVar158._4_4_ = fVar78 * fStack_3bc;
                      auVar158._8_4_ = fVar78 * fStack_3b8;
                      auVar158._12_4_ = fVar78 * fStack_3b4;
                      auVar146._4_4_ = fVar139;
                      auVar146._0_4_ = fVar139;
                      auVar146._8_4_ = fVar139;
                      auVar146._12_4_ = fVar139;
                      auVar68._8_8_ = uStack_508;
                      auVar68._0_8_ = local_510;
                      auVar81 = vfmadd132ps_fma(auVar146,auVar158,auVar68);
                      auVar150._4_4_ = fVar142;
                      auVar150._0_4_ = fVar142;
                      auVar150._8_4_ = fVar142;
                      auVar150._12_4_ = fVar142;
                      auVar81 = vfmadd213ps_fma(auVar150,local_400,auVar81);
                      auVar147._4_4_ = fVar159;
                      auVar147._0_4_ = fVar159;
                      auVar147._8_4_ = fVar159;
                      auVar147._12_4_ = fVar159;
                      auVar81 = vfmadd213ps_fma(auVar147,local_3f0,auVar81);
                      local_4d0 = vmovlps_avx(auVar81);
                      local_4c8 = vextractps_avx(auVar81,2);
                      local_4bc = (int)local_488;
                      local_4b8 = (int)local_530;
                      local_4b4 = (local_500.context)->instID[0];
                      local_4b0 = (local_500.context)->instPrimID[0];
                      local_54c = -1;
                      local_500.valid = &local_54c;
                      local_500.geometryUserPtr = local_490->userPtr;
                      local_500.ray = (RTCRayN *)local_538;
                      local_500.hit = (RTCHitN *)&local_4d0;
                      local_500.N = 1;
                      if ((local_490->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                         ((*local_490->occlusionFilterN)(&local_500), *local_500.valid != 0)) {
                        auVar81 = auVar174._0_16_;
                        p_Var15 = local_498->args->filter;
                        if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                           (((local_498->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((local_490->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var15)(&local_500);
                          auVar81 = auVar174._0_16_;
                          if (*local_500.valid == 0) goto LAB_01a8749a;
                        }
                        bVar69 = 1;
                        auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar81 = vxorps_avx512vl(auVar81,auVar81);
                        goto LAB_01a87553;
                      }
LAB_01a8749a:
                      local_538->tfar = local_514;
                      lVar70 = 0;
                      local_528 = local_528 ^ 1L << (local_410._0_8_ & 0x3f);
                      for (uVar72 = local_528; (uVar72 & 1) == 0;
                          uVar72 = uVar72 >> 1 | 0x8000000000000000) {
                        lVar70 = lVar70 + 1;
                      }
                    }
                    bVar69 = 0;
                    auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar81 = vxorps_avx512vl(auVar174._0_16_,auVar174._0_16_);
LAB_01a87553:
                    auVar182 = ZEXT3264(auVar94);
                    auVar174 = ZEXT1664(auVar81);
                    auVar175 = ZEXT3264(local_340);
                    auVar178 = ZEXT3264(local_360);
                    auVar176 = ZEXT3264(local_3a0);
                    auVar181 = ZEXT3264(local_380);
                    auVar177 = ZEXT3264(local_440);
                    auVar179 = ZEXT3264(local_460);
                    auVar183 = ZEXT3264(local_3e0);
                    auVar180 = ZEXT3264(local_480);
                    context = local_498;
                    uVar72 = local_530;
                  }
                  bVar74 = (bool)(bVar74 | bVar69);
                }
              }
              goto LAB_01a874d2;
            }
          }
          auVar177 = ZEXT3264(local_440);
          auVar179 = ZEXT3264(local_460);
          auVar183 = ZEXT3264(local_3e0);
          auVar180 = ZEXT3264(local_480);
        }
LAB_01a874d2:
      }
    }
    if (bVar74) break;
    fVar159 = local_538->tfar;
    auVar27._4_4_ = fVar159;
    auVar27._0_4_ = fVar159;
    auVar27._8_4_ = fVar159;
    auVar27._12_4_ = fVar159;
    auVar27._16_4_ = fVar159;
    auVar27._20_4_ = fVar159;
    auVar27._24_4_ = fVar159;
    auVar27._28_4_ = fVar159;
    uVar140 = vcmpps_avx512vl(local_80,auVar27,2);
    local_3a8 = (ulong)((uint)uVar75 & (uint)uVar140);
  }
  return local_3a8 != 0;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));
         
          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }